

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O3

void __thiscall uint256_tests::basics::test_method(basics *this)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  long lVar4;
  pointer pcVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  shared_count *psVar9;
  size_t sVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  int iVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  uint uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  iterator in_R8;
  iterator pvVar24;
  iterator in_R9;
  iterator pvVar25;
  long in_FS_OFFSET;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  string_view str;
  const_string file_20;
  string_view str_00;
  const_string file_21;
  string_view str_01;
  const_string file_22;
  string_view str_02;
  const_string file_23;
  string_view str_03;
  const_string file_24;
  string_view str_04;
  const_string file_25;
  string_view str_05;
  const_string file_26;
  string_view str_06;
  const_string file_27;
  string_view str_07;
  const_string file_28;
  const_string file_29;
  string_view str_08;
  const_string file_30;
  string_view str_09;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  string_view str_10;
  const_string file_35;
  string_view str_11;
  const_string file_36;
  string_view str_12;
  const_string file_37;
  string_view str_13;
  const_string file_38;
  string_view str_14;
  const_string file_39;
  string_view str_15;
  const_string file_40;
  string_view str_16;
  const_string file_41;
  string_view str_17;
  const_string file_42;
  string_view str_18;
  const_string file_43;
  const_string file_44;
  string_view str_19;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  lazy_ostream local_178;
  undefined1 *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  base_blob<256U> *local_130;
  string *local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  uint160 *local_100;
  undefined **local_f8;
  undefined1 local_f0 [8];
  shared_count sStack_e8;
  uint160 *local_e0;
  uint160 rv_12;
  uint160 rv_17;
  undefined4 uStack_a4;
  uint160 rv_21;
  undefined4 uStack_84;
  uint256 rv;
  uint160 rv_18;
  undefined1 **ppuVar22;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_140 = "";
  ppuVar22 = &local_158;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4b;
  file.m_begin = (iterator)&local_148;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar22,msg);
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv,&R1L);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)R1Array,(uchar *)0x20,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_e0 = &rv_18;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(stack0xffffffffffffff11 << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xe61b5f,(size_t)&rv_12,0x4b,
             &local_f8,"ArrayToString(R1Array,32)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_180 = "";
  ppuVar22 = &local_198;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4c;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar25;
  msg_00.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar22,msg_00)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,R1S);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)R1Array,(uchar *)0x14,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf71640,(size_t)&rv_12,0x4c,
             &local_f8,"ArrayToString(R1Array,20)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1a0 = "";
  ppuVar22 = &local_1b8;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4d;
  file_01.m_begin = (iterator)&local_1a8;
  msg_01.m_end = pvVar25;
  msg_01.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar22,msg_01)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv,&R2L);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)R2Array,(uchar *)0x20,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xe61b7e,(size_t)&rv_12,0x4d,
             &local_f8,"ArrayToString(R2Array,32)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1c0 = "";
  ppuVar22 = &local_1d8;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4e;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar25;
  msg_02.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar22,msg_02)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,R2S);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)R2Array,(uchar *)0x14,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf71669,(size_t)&rv_12,0x4e,
             &local_f8,"ArrayToString(R2Array,20)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1e0 = "";
  ppuVar22 = &local_1f8;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4f;
  file_03.m_begin = (iterator)&local_1e8;
  msg_03.m_end = pvVar25;
  msg_03.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)ppuVar22,msg_03)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv,ZeroL);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf71692,(size_t)&rv_12,0x4f,
             &local_f8,"ArrayToString(ZeroArray,32)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_200 = "";
  ppuVar22 = &local_218;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = &DAT_00000050;
  file_04.m_begin = (iterator)&local_208;
  msg_04.m_end = pvVar25;
  msg_04.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)ppuVar22,msg_04)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,ZeroS);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf716a3,(size_t)&rv_12,0x50,
             &local_f8,"ArrayToString(ZeroArray,20)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_220 = "";
  ppuVar22 = &local_238;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x51;
  file_05.m_begin = (iterator)&local_228;
  msg_05.m_end = pvVar25;
  msg_05.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar22,msg_05)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv,OneL);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)OneArray,(uchar *)0x20,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xe61b9e,(size_t)&rv_12,0x51,
             &local_f8,"ArrayToString(OneArray,32)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_240 = "";
  ppuVar22 = &local_258;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x52;
  file_06.m_begin = (iterator)&local_248;
  msg_06.m_end = pvVar25;
  msg_06.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar22,msg_06)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,OneS);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)OneArray,(uchar *)0x14,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf716d0,(size_t)&rv_12,0x52,
             &local_f8,"ArrayToString(OneArray,20)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_260 = "";
  ppuVar22 = &local_278;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x53;
  file_07.m_begin = (iterator)&local_268;
  msg_07.m_end = pvVar25;
  msg_07.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar22,msg_07)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv,MaxL);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)MaxArray,(uchar *)0x20,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xe61bbf,(size_t)&rv_12,0x53,
             &local_f8,"ArrayToString(MaxArray,32)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_280 = "";
  ppuVar22 = &local_298;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x54;
  file_08.m_begin = (iterator)&local_288;
  msg_08.m_end = pvVar25;
  msg_08.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar22,msg_08)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,MaxS);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)MaxArray,(uchar *)0x14,uVar21);
  sVar10 = CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0xf],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0xe],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0xd],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[0xc],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems
                                                        [0xb],CONCAT12(rv.super_base_blob<256U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  rv.super_base_blob<256U>.m_data._M_elems[8])))))))
  ;
  if (sVar10 == CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[0xf],
                         CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[0xe],
                                  CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[0xd],
                                           CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[0xc]
                                                    ,CONCAT13(rv_21.super_base_blob<160U>.m_data.
                                                              _M_elems[0xb],
                                                              CONCAT12(rv_21.super_base_blob<160U>.
                                                                       m_data._M_elems[10],
                                                                       CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[9],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[8]))))
                                          )))) {
    if (sVar10 == 0) {
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = true;
    }
    else {
      iVar19 = bcmp((void *)CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                                     CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                                              CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                                       CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[4],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[3],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [1],rv.super_base_blob<256U>.m_data.
                                                               _M_elems[0]))))))),
                    (void *)CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                                     CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                                              CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems
                                                       [5],CONCAT14(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[4],
                                                                    CONCAT13(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[3],
                                                  CONCAT12(rv_21.super_base_blob<160U>.m_data.
                                                           _M_elems[2],
                                                           CONCAT11(rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[1],
                                                                    rv_21.super_base_blob<160U>.
                                                                    m_data._M_elems[0]))))))),sVar10
                   );
      rv_17.super_base_blob<160U>.m_data._M_elems[0] = iVar19 == 0;
    }
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = false;
  }
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)(string *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf716fb,(size_t)&rv_12,0x54,
             &local_f8,"ArrayToString(MaxArray,20)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2a0 = "";
  ppuVar22 = &local_2b8;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x55;
  file_09.m_begin = (iterator)&local_2a8;
  msg_09.m_end = pvVar25;
  msg_09.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar22,msg_09)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv,OneL);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar21);
  boost::test_tools::tt_detail::ne_impl::operator()
            ((assertion_result *)&rv_17,(ne_impl *)&local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21);
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] =
       (uchar)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,3,REQUIRE,0xe61b9e,(size_t)&rv_12,0x55,
             &local_f8,"ArrayToString(ZeroArray,32)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2c0 = "";
  ppuVar22 = &local_2d8;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x56;
  file_10.m_begin = (iterator)&local_2c8;
  msg_10.m_end = pvVar25;
  msg_10.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar22,msg_10)
  ;
  uVar21 = (uint)ppuVar22;
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,OneS);
  ArrayToString_abi_cxx11_((string *)&rv_21,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar21);
  boost::test_tools::tt_detail::ne_impl::operator()
            ((assertion_result *)&rv_17,(ne_impl *)&local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21);
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] =
       (uchar)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013ae148;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_18;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae148;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,3,REQUIRE,0xf716d0,(size_t)&rv_12,0x56,
             &local_f8,"ArrayToString(ZeroArray,20)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x59;
  file_11.m_begin = (iterator)&local_2e8;
  msg_11.m_end = pvVar25;
  msg_11.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2f8,
             msg_11);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  auVar50[0] = -(R2L == R1L);
  auVar50[1] = -(uRam00000000013c7496 == uRam00000000013c7462);
  auVar50[2] = -(uRam00000000013c7497 == uRam00000000013c7463);
  auVar50[3] = -(uRam00000000013c7498 == uRam00000000013c7464);
  auVar50[4] = -(uRam00000000013c7499 == uRam00000000013c7465);
  auVar50[5] = -(uRam00000000013c749a == uRam00000000013c7466);
  auVar50[6] = -(uRam00000000013c749b == uRam00000000013c7467);
  auVar50[7] = -(uRam00000000013c749c == uRam00000000013c7468);
  auVar50[8] = -(uRam00000000013c749d == uRam00000000013c7469);
  auVar50[9] = -(uRam00000000013c749e == uRam00000000013c746a);
  auVar50[10] = -(uRam00000000013c749f == uRam00000000013c746b);
  auVar50[0xb] = -(uRam00000000013c74a0 == uRam00000000013c746c);
  auVar50[0xc] = -(uRam00000000013c74a1 == uRam00000000013c746d);
  auVar50[0xd] = -(uRam00000000013c74a2 == uRam00000000013c746e);
  auVar50[0xe] = -(uRam00000000013c74a3 == uRam00000000013c746f);
  auVar50[0xf] = -(uRam00000000013c74a4 == uRam00000000013c7470);
  auVar70[0] = -(DAT_013c74a5 == DAT_013c7471);
  auVar70[1] = -(uRam00000000013c74a6 == uRam00000000013c7472);
  auVar70[2] = -(uRam00000000013c74a7 == uRam00000000013c7473);
  auVar70[3] = -(uRam00000000013c74a8 == uRam00000000013c7474);
  auVar70[4] = -(uRam00000000013c74a9 == uRam00000000013c7475);
  auVar70[5] = -(uRam00000000013c74aa == uRam00000000013c7476);
  auVar70[6] = -(uRam00000000013c74ab == uRam00000000013c7477);
  auVar70[7] = -(uRam00000000013c74ac == uRam00000000013c7478);
  auVar70[8] = -(uRam00000000013c74ad == uRam00000000013c7479);
  auVar70[9] = -(uRam00000000013c74ae == uRam00000000013c747a);
  auVar70[10] = -(uRam00000000013c74af == uRam00000000013c747b);
  auVar70[0xb] = -(uRam00000000013c74b0 == uRam00000000013c747c);
  auVar70[0xc] = -(uRam00000000013c74b1 == uRam00000000013c747d);
  auVar70[0xd] = -(uRam00000000013c74b2 == uRam00000000013c747e);
  auVar70[0xe] = -(uRam00000000013c74b3 == uRam00000000013c747f);
  auVar70[0xf] = -(DAT_013c74b4 == DAT_013c7480);
  auVar70 = auVar70 & auVar50;
  bVar26 = (ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar70[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  local_160 = "";
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  builtin_memcpy(rv_17.super_base_blob<160U>.m_data._M_elems,"at<\x01",5);
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0x95;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xe622fa,(size_t)&rv_21,0x59,&local_f8,
             "R2L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x59;
  file_12.m_begin = (iterator)&local_308;
  msg_12.m_end = pvVar25;
  msg_12.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_318,
             msg_12);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  auVar51[0] = -(R2S[0] == R1S[0]);
  auVar51[1] = -(R2S[1] == R1S[1]);
  auVar51[2] = -(R2S[2] == R1S[2]);
  auVar51[3] = -(R2S[3] == R1S[3]);
  auVar51[4] = -(R2S[4] == R1S[4]);
  auVar51[5] = -(R2S[5] == R1S[5]);
  auVar51[6] = -(R2S[6] == R1S[6]);
  auVar51[7] = -(R2S[7] == R1S[7]);
  auVar51[8] = -(R2S[8] == R1S[8]);
  auVar51[9] = -(R2S[9] == R1S[9]);
  auVar51[10] = -(R2S[10] == R1S[10]);
  auVar51[0xb] = -(R2S[0xb] == R1S[0xb]);
  auVar51[0xc] = -(R2S[0xc] == R1S[0xc]);
  auVar51[0xd] = -(R2S[0xd] == R1S[0xd]);
  auVar51[0xe] = -(R2S[0xe] == R1S[0xe]);
  auVar51[0xf] = -(R2S[0xf] == R1S[0xf]);
  auVar71[0] = -(R2S[0x10] == R1S[0x10]);
  auVar71[1] = -(R2S[0x11] == R1S[0x11]);
  auVar71[2] = -(R2S[0x12] == R1S[0x12]);
  auVar71[3] = -(R2S[0x13] == R1S[0x13]);
  auVar71[4] = 0xff;
  auVar71[5] = 0xff;
  auVar71[6] = 0xff;
  auVar71[7] = 0xff;
  auVar71[8] = 0xff;
  auVar71[9] = 0xff;
  auVar71[10] = 0xff;
  auVar71[0xb] = 0xff;
  auVar71[0xc] = 0xff;
  auVar71[0xd] = 0xff;
  auVar71[0xe] = 0xff;
  auVar71[0xf] = 0xff;
  auVar71 = auVar71 & auVar51;
  bVar26 = (ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0x81;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xb5;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xf71726,(size_t)&rv_21,0x59,&local_f8,
             "R2S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x5a;
  file_13.m_begin = (iterator)&local_328;
  msg_13.m_end = pvVar25;
  msg_13.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_338,
             msg_13);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  auVar52[0] = -(OneL[0] == ZeroL[0]);
  auVar52[1] = -(OneL[1] == ZeroL[1]);
  auVar52[2] = -(OneL[2] == ZeroL[2]);
  auVar52[3] = -(OneL[3] == ZeroL[3]);
  auVar52[4] = -(OneL[4] == ZeroL[4]);
  auVar52[5] = -(OneL[5] == ZeroL[5]);
  auVar52[6] = -(OneL[6] == ZeroL[6]);
  auVar52[7] = -(OneL[7] == ZeroL[7]);
  auVar52[8] = -(OneL[8] == ZeroL[8]);
  auVar52[9] = -(OneL[9] == ZeroL[9]);
  auVar52[10] = -(OneL[10] == ZeroL[10]);
  auVar52[0xb] = -(OneL[0xb] == ZeroL[0xb]);
  auVar52[0xc] = -(OneL[0xc] == ZeroL[0xc]);
  auVar52[0xd] = -(OneL[0xd] == ZeroL[0xd]);
  auVar52[0xe] = -(OneL[0xe] == ZeroL[0xe]);
  auVar52[0xf] = -(OneL[0xf] == ZeroL[0xf]);
  auVar72[0] = -(OneL[0x10] == ZeroL[0x10]);
  auVar72[1] = -(OneL[0x11] == ZeroL[0x11]);
  auVar72[2] = -(OneL[0x12] == ZeroL[0x12]);
  auVar72[3] = -(OneL[0x13] == ZeroL[0x13]);
  auVar72[4] = -(OneL[0x14] == ZeroL[0x14]);
  auVar72[5] = -(OneL[0x15] == ZeroL[0x15]);
  auVar72[6] = -(OneL[0x16] == ZeroL[0x16]);
  auVar72[7] = -(OneL[0x17] == ZeroL[0x17]);
  auVar72[8] = -(OneL[0x18] == ZeroL[0x18]);
  auVar72[9] = -(OneL[0x19] == ZeroL[0x19]);
  auVar72[10] = -(OneL[0x1a] == ZeroL[0x1a]);
  auVar72[0xb] = -(OneL[0x1b] == ZeroL[0x1b]);
  auVar72[0xc] = -(OneL[0x1c] == ZeroL[0x1c]);
  auVar72[0xd] = -(OneL[0x1d] == ZeroL[0x1d]);
  auVar72[0xe] = -(OneL[0x1e] == ZeroL[0x1e]);
  auVar72[0xf] = -(OneL[0x1f] == ZeroL[0x1f]);
  auVar72 = auVar72 & auVar52;
  bVar26 = (ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar72[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xc9;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xfd;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xe60219,(size_t)&rv_21,0x5a,&local_f8,
             "OneL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x5a;
  file_14.m_begin = (iterator)&local_348;
  msg_14.m_end = pvVar25;
  msg_14.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_358,
             msg_14);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  auVar53[0] = -(OneS[0] == ZeroS[0]);
  auVar53[1] = -(OneS[1] == ZeroS[1]);
  auVar53[2] = -(OneS[2] == ZeroS[2]);
  auVar53[3] = -(OneS[3] == ZeroS[3]);
  auVar53[4] = -(OneS[4] == ZeroS[4]);
  auVar53[5] = -(OneS[5] == ZeroS[5]);
  auVar53[6] = -(OneS[6] == ZeroS[6]);
  auVar53[7] = -(OneS[7] == ZeroS[7]);
  auVar53[8] = -(OneS[8] == ZeroS[8]);
  auVar53[9] = -(OneS[9] == ZeroS[9]);
  auVar53[10] = -(OneS[10] == ZeroS[10]);
  auVar53[0xb] = -(OneS[0xb] == ZeroS[0xb]);
  auVar53[0xc] = -(OneS[0xc] == ZeroS[0xc]);
  auVar53[0xd] = -(OneS[0xd] == ZeroS[0xd]);
  auVar53[0xe] = -(OneS[0xe] == ZeroS[0xe]);
  auVar53[0xf] = -(OneS[0xf] == ZeroS[0xf]);
  auVar73[0] = -(OneS[0x10] == ZeroS[0x10]);
  auVar73[1] = -(OneS[0x11] == ZeroS[0x11]);
  auVar73[2] = -(OneS[0x12] == ZeroS[0x12]);
  auVar73[3] = -(OneS[0x13] == ZeroS[0x13]);
  auVar73[4] = 0xff;
  auVar73[5] = 0xff;
  auVar73[6] = 0xff;
  auVar73[7] = 0xff;
  auVar73[8] = 0xff;
  auVar73[9] = 0xff;
  auVar73[10] = 0xff;
  auVar73[0xb] = 0xff;
  auVar73[0xc] = 0xff;
  auVar73[0xd] = 0xff;
  auVar73[0xe] = 0xff;
  auVar73[0xf] = 0xff;
  auVar73 = auVar73 & auVar53;
  bVar26 = (ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar73[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe9;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  builtin_memcpy(rv_12.super_base_blob<160U>.m_data._M_elems,"\x1du<\x01",5);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xf7172e,(size_t)&rv_21,0x5a,&local_f8,
             "OneS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x5b;
  file_15.m_begin = (iterator)&local_368;
  msg_15.m_end = pvVar25;
  msg_15.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_378,
             msg_15);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  auVar54[0] = -(ZeroL[0] == OneL[0]);
  auVar54[1] = -(ZeroL[1] == OneL[1]);
  auVar54[2] = -(ZeroL[2] == OneL[2]);
  auVar54[3] = -(ZeroL[3] == OneL[3]);
  auVar54[4] = -(ZeroL[4] == OneL[4]);
  auVar54[5] = -(ZeroL[5] == OneL[5]);
  auVar54[6] = -(ZeroL[6] == OneL[6]);
  auVar54[7] = -(ZeroL[7] == OneL[7]);
  auVar54[8] = -(ZeroL[8] == OneL[8]);
  auVar54[9] = -(ZeroL[9] == OneL[9]);
  auVar54[10] = -(ZeroL[10] == OneL[10]);
  auVar54[0xb] = -(ZeroL[0xb] == OneL[0xb]);
  auVar54[0xc] = -(ZeroL[0xc] == OneL[0xc]);
  auVar54[0xd] = -(ZeroL[0xd] == OneL[0xd]);
  auVar54[0xe] = -(ZeroL[0xe] == OneL[0xe]);
  auVar54[0xf] = -(ZeroL[0xf] == OneL[0xf]);
  auVar74[0] = -(ZeroL[0x10] == OneL[0x10]);
  auVar74[1] = -(ZeroL[0x11] == OneL[0x11]);
  auVar74[2] = -(ZeroL[0x12] == OneL[0x12]);
  auVar74[3] = -(ZeroL[0x13] == OneL[0x13]);
  auVar74[4] = -(ZeroL[0x14] == OneL[0x14]);
  auVar74[5] = -(ZeroL[0x15] == OneL[0x15]);
  auVar74[6] = -(ZeroL[0x16] == OneL[0x16]);
  auVar74[7] = -(ZeroL[0x17] == OneL[0x17]);
  auVar74[8] = -(ZeroL[0x18] == OneL[0x18]);
  auVar74[9] = -(ZeroL[0x19] == OneL[0x19]);
  auVar74[10] = -(ZeroL[0x1a] == OneL[0x1a]);
  auVar74[0xb] = -(ZeroL[0x1b] == OneL[0x1b]);
  auVar74[0xc] = -(ZeroL[0x1c] == OneL[0x1c]);
  auVar74[0xd] = -(ZeroL[0x1d] == OneL[0x1d]);
  auVar74[0xe] = -(ZeroL[0x1e] == OneL[0x1e]);
  auVar74[0xf] = -(ZeroL[0x1f] == OneL[0x1f]);
  auVar74 = auVar74 & auVar54;
  bVar26 = (ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar74[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xfd;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xc9;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xe601aa,(size_t)&rv_21,0x5b,&local_f8,
             "ZeroL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x5b;
  file_16.m_begin = (iterator)&local_388;
  msg_16.m_end = pvVar25;
  msg_16.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_398,
             msg_16);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  auVar55[0] = -(ZeroS[0] == OneS[0]);
  auVar55[1] = -(ZeroS[1] == OneS[1]);
  auVar55[2] = -(ZeroS[2] == OneS[2]);
  auVar55[3] = -(ZeroS[3] == OneS[3]);
  auVar55[4] = -(ZeroS[4] == OneS[4]);
  auVar55[5] = -(ZeroS[5] == OneS[5]);
  auVar55[6] = -(ZeroS[6] == OneS[6]);
  auVar55[7] = -(ZeroS[7] == OneS[7]);
  auVar55[8] = -(ZeroS[8] == OneS[8]);
  auVar55[9] = -(ZeroS[9] == OneS[9]);
  auVar55[10] = -(ZeroS[10] == OneS[10]);
  auVar55[0xb] = -(ZeroS[0xb] == OneS[0xb]);
  auVar55[0xc] = -(ZeroS[0xc] == OneS[0xc]);
  auVar55[0xd] = -(ZeroS[0xd] == OneS[0xd]);
  auVar55[0xe] = -(ZeroS[0xe] == OneS[0xe]);
  auVar55[0xf] = -(ZeroS[0xf] == OneS[0xf]);
  auVar75[0] = -(ZeroS[0x10] == OneS[0x10]);
  auVar75[1] = -(ZeroS[0x11] == OneS[0x11]);
  auVar75[2] = -(ZeroS[0x12] == OneS[0x12]);
  auVar75[3] = -(ZeroS[0x13] == OneS[0x13]);
  auVar75[4] = 0xff;
  auVar75[5] = 0xff;
  auVar75[6] = 0xff;
  auVar75[7] = 0xff;
  auVar75[8] = 0xff;
  auVar75[9] = 0xff;
  auVar75[10] = 0xff;
  auVar75[0xb] = 0xff;
  auVar75[0xc] = 0xff;
  auVar75[0xd] = 0xff;
  auVar75[0xe] = 0xff;
  auVar75[0xf] = 0xff;
  auVar75 = auVar75 & auVar55;
  bVar26 = (ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar75[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  builtin_memcpy(rv_17.super_base_blob<160U>.m_data._M_elems,"\x1du<\x01",5);
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe9;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xf71734,(size_t)&rv_21,0x5b,&local_f8,
             "ZeroS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x5c;
  file_17.m_begin = (iterator)&local_3a8;
  msg_17.m_end = pvVar25;
  msg_17.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_3b8,
             msg_17);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  auVar56[0] = -(ZeroL[0] == MaxL[0]);
  auVar56[1] = -(ZeroL[1] == MaxL[1]);
  auVar56[2] = -(ZeroL[2] == MaxL[2]);
  auVar56[3] = -(ZeroL[3] == MaxL[3]);
  auVar56[4] = -(ZeroL[4] == MaxL[4]);
  auVar56[5] = -(ZeroL[5] == MaxL[5]);
  auVar56[6] = -(ZeroL[6] == MaxL[6]);
  auVar56[7] = -(ZeroL[7] == MaxL[7]);
  auVar56[8] = -(ZeroL[8] == MaxL[8]);
  auVar56[9] = -(ZeroL[9] == MaxL[9]);
  auVar56[10] = -(ZeroL[10] == MaxL[10]);
  auVar56[0xb] = -(ZeroL[0xb] == MaxL[0xb]);
  auVar56[0xc] = -(ZeroL[0xc] == MaxL[0xc]);
  auVar56[0xd] = -(ZeroL[0xd] == MaxL[0xd]);
  auVar56[0xe] = -(ZeroL[0xe] == MaxL[0xe]);
  auVar56[0xf] = -(ZeroL[0xf] == MaxL[0xf]);
  auVar76[0] = -(ZeroL[0x10] == MaxL[0x10]);
  auVar76[1] = -(ZeroL[0x11] == MaxL[0x11]);
  auVar76[2] = -(ZeroL[0x12] == MaxL[0x12]);
  auVar76[3] = -(ZeroL[0x13] == MaxL[0x13]);
  auVar76[4] = -(ZeroL[0x14] == MaxL[0x14]);
  auVar76[5] = -(ZeroL[0x15] == MaxL[0x15]);
  auVar76[6] = -(ZeroL[0x16] == MaxL[0x16]);
  auVar76[7] = -(ZeroL[0x17] == MaxL[0x17]);
  auVar76[8] = -(ZeroL[0x18] == MaxL[0x18]);
  auVar76[9] = -(ZeroL[0x19] == MaxL[0x19]);
  auVar76[10] = -(ZeroL[0x1a] == MaxL[0x1a]);
  auVar76[0xb] = -(ZeroL[0x1b] == MaxL[0x1b]);
  auVar76[0xc] = -(ZeroL[0x1c] == MaxL[0x1c]);
  auVar76[0xd] = -(ZeroL[0x1d] == MaxL[0x1d]);
  auVar76[0xe] = -(ZeroL[0x1e] == MaxL[0x1e]);
  auVar76[0xf] = -(ZeroL[0x1f] == MaxL[0x1f]);
  auVar76 = auVar76 & auVar56;
  bVar26 = (ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar76[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  builtin_memcpy(rv_17.super_base_blob<160U>.m_data._M_elems,"1u<\x01",5);
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xc9;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xe60367,(size_t)&rv_21,0x5c,&local_f8,
             "ZeroL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x5c;
  file_18.m_begin = (iterator)&local_3c8;
  msg_18.m_end = pvVar25;
  msg_18.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_3d8,
             msg_18);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  auVar57[0] = -(ZeroS[0] == MaxS[0]);
  auVar57[1] = -(ZeroS[1] == MaxS[1]);
  auVar57[2] = -(ZeroS[2] == MaxS[2]);
  auVar57[3] = -(ZeroS[3] == MaxS[3]);
  auVar57[4] = -(ZeroS[4] == MaxS[4]);
  auVar57[5] = -(ZeroS[5] == MaxS[5]);
  auVar57[6] = -(ZeroS[6] == MaxS[6]);
  auVar57[7] = -(ZeroS[7] == MaxS[7]);
  auVar57[8] = -(ZeroS[8] == MaxS[8]);
  auVar57[9] = -(ZeroS[9] == MaxS[9]);
  auVar57[10] = -(ZeroS[10] == MaxS[10]);
  auVar57[0xb] = -(ZeroS[0xb] == MaxS[0xb]);
  auVar57[0xc] = -(ZeroS[0xc] == MaxS[0xc]);
  auVar57[0xd] = -(ZeroS[0xd] == MaxS[0xd]);
  auVar57[0xe] = -(ZeroS[0xe] == MaxS[0xe]);
  auVar57[0xf] = -(ZeroS[0xf] == MaxS[0xf]);
  auVar77[0] = -(ZeroS[0x10] == MaxS[0x10]);
  auVar77[1] = -(ZeroS[0x11] == MaxS[0x11]);
  auVar77[2] = -(ZeroS[0x12] == MaxS[0x12]);
  auVar77[3] = -(ZeroS[0x13] == MaxS[0x13]);
  auVar77[4] = 0xff;
  auVar77[5] = 0xff;
  auVar77[6] = 0xff;
  auVar77[7] = 0xff;
  auVar77[8] = 0xff;
  auVar77[9] = 0xff;
  auVar77[10] = 0xff;
  auVar77[0xb] = 0xff;
  auVar77[0xc] = 0xff;
  auVar77[0xd] = 0xff;
  auVar77[0xe] = 0xff;
  auVar77[0xf] = 0xff;
  auVar77 = auVar77 & auVar57;
  bVar26 = (ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar77[0xf] >> 7) << 0xf) == 0xffff;
  local_f8 = (undefined **)CONCAT71(local_f8._1_7_,bVar26);
  _local_f0 = (undefined1  [16])0x0;
  rv.super_base_blob<256U>.m_data._M_elems[0] = !bVar26;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  boost::detail::shared_count::~shared_count((shared_count *)(local_f0 + 8));
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  builtin_memcpy(rv_17.super_base_blob<160U>.m_data._M_elems,"Qu<\x01",5);
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_17;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe9;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_12;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,3,REQUIRE,0xf71739,(size_t)&rv_21,0x5c,&local_f8,
             "ZeroS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x5f;
  file_19.m_begin = (iterator)&local_3e8;
  msg_19.m_end = pvVar25;
  msg_19.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_3f8,
             msg_19);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_17,&R1L);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"0x",2);
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)&rv,str);
  auVar58[0] = -(DAT_013c7471 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar58[1] = -(uRam00000000013c7472 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar58[2] = -(uRam00000000013c7473 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar58[3] = -(uRam00000000013c7474 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar58[4] = -(uRam00000000013c7475 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar58[5] = -(uRam00000000013c7476 == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar58[6] = -(uRam00000000013c7477 == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar58[7] = -(uRam00000000013c7478 == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar58[8] = -(uRam00000000013c7479 == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar58[9] = -(uRam00000000013c747a == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar58[10] = -(uRam00000000013c747b == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar58[0xb] = -(uRam00000000013c747c == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar58[0xc] = -(uRam00000000013c747d == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar58[0xd] = -(uRam00000000013c747e == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar58[0xe] = -(uRam00000000013c747f == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar58[0xf] = -(DAT_013c7480 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar27[0] = -(R1L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar27[1] = -(uRam00000000013c7462 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar27[2] = -(uRam00000000013c7463 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar27[3] = -(uRam00000000013c7464 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar27[4] = -(uRam00000000013c7465 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar27[5] = -(uRam00000000013c7466 == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar27[6] = -(uRam00000000013c7467 == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar27[7] = -(uRam00000000013c7468 == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar27[8] = -(uRam00000000013c7469 == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar27[9] = -(uRam00000000013c746a == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar27[10] = -(uRam00000000013c746b == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar27[0xb] = -(uRam00000000013c746c == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar27[0xc] = -(uRam00000000013c746d == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar27[0xd] = -(uRam00000000013c746e == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar27[0xe] = -(uRam00000000013c746f == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar27[0xf] = -(uRam00000000013c7470 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar27 = auVar27 & auVar58;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)&R1L;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf7173e,(size_t)&rv_18,0x5f,
             &local_f8,"R1L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_17.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x60;
  file_20.m_begin = (iterator)&local_408;
  msg_20.m_end = pvVar25;
  msg_20.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_418,
             msg_20);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_17,&R2L);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"0x",2);
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_00._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_00._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_00._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_00._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_00._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_00._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_00._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_00._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_00._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)&rv,str_00);
  auVar59[0] = -(DAT_013c74a5 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar59[1] = -(uRam00000000013c74a6 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar59[2] = -(uRam00000000013c74a7 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar59[3] = -(uRam00000000013c74a8 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar59[4] = -(uRam00000000013c74a9 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar59[5] = -(uRam00000000013c74aa == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar59[6] = -(uRam00000000013c74ab == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar59[7] = -(uRam00000000013c74ac == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar59[8] = -(uRam00000000013c74ad == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar59[9] = -(uRam00000000013c74ae == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar59[10] = -(uRam00000000013c74af == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar59[0xb] = -(uRam00000000013c74b0 == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar59[0xc] = -(uRam00000000013c74b1 == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar59[0xd] = -(uRam00000000013c74b2 == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar59[0xe] = -(uRam00000000013c74b3 == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar59[0xf] = -(DAT_013c74b4 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar28[0] = -(R2L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar28[1] = -(uRam00000000013c7496 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar28[2] = -(uRam00000000013c7497 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar28[3] = -(uRam00000000013c7498 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar28[4] = -(uRam00000000013c7499 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar28[5] = -(uRam00000000013c749a == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar28[6] = -(uRam00000000013c749b == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar28[7] = -(uRam00000000013c749c == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar28[8] = -(uRam00000000013c749d == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar28[9] = -(uRam00000000013c749e == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar28[10] = -(uRam00000000013c749f == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar28[0xb] = -(uRam00000000013c74a0 == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar28[0xc] = -(uRam00000000013c74a1 == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar28[0xd] = -(uRam00000000013c74a2 == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar28[0xe] = -(uRam00000000013c74a3 == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar28[0xf] = -(uRam00000000013c74a4 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar28 = auVar28 & auVar59;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)&R2L;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf7175c,(size_t)&rv_18,0x60,
             &local_f8,"R2L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_17.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x61;
  file_21.m_begin = (iterator)&local_428;
  msg_21.m_end = pvVar25;
  msg_21.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_438,
             msg_21);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_17,ZeroL);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"0x",2);
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_01._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_01._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_01._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_01._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_01._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_01._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_01._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_01._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_01._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)&rv,str_01);
  auVar60[0] = -(ZeroL[0x10] == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar60[1] = -(ZeroL[0x11] == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar60[2] = -(ZeroL[0x12] == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar60[3] = -(ZeroL[0x13] == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar60[4] = -(ZeroL[0x14] == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar60[5] = -(ZeroL[0x15] == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar60[6] = -(ZeroL[0x16] == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar60[7] = -(ZeroL[0x17] == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar60[8] = -(ZeroL[0x18] == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar60[9] = -(ZeroL[0x19] == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar60[10] = -(ZeroL[0x1a] == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar60[0xb] = -(ZeroL[0x1b] == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar60[0xc] = -(ZeroL[0x1c] == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar60[0xd] = -(ZeroL[0x1d] == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar60[0xe] = -(ZeroL[0x1e] == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar60[0xf] = -(ZeroL[0x1f] == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar29[0] = -(ZeroL[0] == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar29[1] = -(ZeroL[1] == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar29[2] = -(ZeroL[2] == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar29[3] = -(ZeroL[3] == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar29[4] = -(ZeroL[4] == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar29[5] = -(ZeroL[5] == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar29[6] = -(ZeroL[6] == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar29[7] = -(ZeroL[7] == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar29[8] = -(ZeroL[8] == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar29[9] = -(ZeroL[9] == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar29[10] = -(ZeroL[10] == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar29[0xb] = -(ZeroL[0xb] == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar29[0xc] = -(ZeroL[0xc] == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar29[0xd] = -(ZeroL[0xd] == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar29[0xe] = -(ZeroL[0xe] == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar29[0xf] = -(ZeroL[0xf] == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar29 = auVar29 & auVar60;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)ZeroL;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf7177a,(size_t)&rv_18,0x61,
             &local_f8,"ZeroL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_17.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x62;
  file_22.m_begin = (iterator)&local_448;
  msg_22.m_end = pvVar25;
  msg_22.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_458,
             msg_22);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_17,OneL);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"0x",2);
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_02._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_02._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_02._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_02._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_02._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_02._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_02._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_02._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_02._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)&rv,str_02);
  auVar61[0] = -(OneL[0x10] == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar61[1] = -(OneL[0x11] == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar61[2] = -(OneL[0x12] == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar61[3] = -(OneL[0x13] == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar61[4] = -(OneL[0x14] == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar61[5] = -(OneL[0x15] == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar61[6] = -(OneL[0x16] == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar61[7] = -(OneL[0x17] == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar61[8] = -(OneL[0x18] == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar61[9] = -(OneL[0x19] == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar61[10] = -(OneL[0x1a] == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar61[0xb] = -(OneL[0x1b] == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar61[0xc] = -(OneL[0x1c] == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar61[0xd] = -(OneL[0x1d] == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar61[0xe] = -(OneL[0x1e] == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar61[0xf] = -(OneL[0x1f] == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar30[0] = -(OneL[0] == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar30[1] = -(OneL[1] == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar30[2] = -(OneL[2] == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar30[3] = -(OneL[3] == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar30[4] = -(OneL[4] == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar30[5] = -(OneL[5] == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar30[6] = -(OneL[6] == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar30[7] = -(OneL[7] == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar30[8] = -(OneL[8] == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar30[9] = -(OneL[9] == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar30[10] = -(OneL[10] == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar30[0xb] = -(OneL[0xb] == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar30[0xc] = -(OneL[0xc] == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar30[0xd] = -(OneL[0xd] == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar30[0xe] = -(OneL[0xe] == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar30[0xf] = -(OneL[0xf] == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar30 = auVar30 & auVar61;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)OneL;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf7179a,(size_t)&rv_18,0x62,
             &local_f8,"OneL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  if (puVar8 != puVar1) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_17.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x63;
  file_23.m_begin = (iterator)&local_468;
  msg_23.m_end = pvVar25;
  msg_23.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_478,
             msg_23);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_17,MaxL);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"0x",2);
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_03._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_03._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_03._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_03._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_03._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_03._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_03._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_03._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_03._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)&rv,str_03);
  auVar62[0] = -(MaxL[0x10] == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar62[1] = -(MaxL[0x11] == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar62[2] = -(MaxL[0x12] == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar62[3] = -(MaxL[0x13] == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar62[4] = -(MaxL[0x14] == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar62[5] = -(MaxL[0x15] == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar62[6] = -(MaxL[0x16] == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar62[7] = -(MaxL[0x17] == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar62[8] = -(MaxL[0x18] == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar62[9] = -(MaxL[0x19] == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar62[10] = -(MaxL[0x1a] == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar62[0xb] = -(MaxL[0x1b] == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar62[0xc] = -(MaxL[0x1c] == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar62[0xd] = -(MaxL[0x1d] == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar62[0xe] = -(MaxL[0x1e] == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar62[0xf] = -(MaxL[0x1f] == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar31[0] = -(MaxL[0] == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar31[1] = -(MaxL[1] == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar31[2] = -(MaxL[2] == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar31[3] = -(MaxL[3] == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar31[4] = -(MaxL[4] == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar31[5] = -(MaxL[5] == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar31[6] = -(MaxL[6] == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar31[7] = -(MaxL[7] == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar31[8] = -(MaxL[8] == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar31[9] = -(MaxL[9] == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar31[10] = -(MaxL[10] == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar31[0xb] = -(MaxL[0xb] == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar31[0xc] = -(MaxL[0xc] == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar31[0xd] = -(MaxL[0xd] == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar31[0xe] = -(MaxL[0xe] == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar31[0xf] = -(MaxL[0xf] == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar31 = auVar31 & auVar62;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)MaxL;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf717b9,(size_t)&rv_18,99,&local_f8,
             "MaxL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_17.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x64;
  file_24.m_begin = (iterator)&local_488;
  msg_24.m_end = pvVar25;
  msg_24.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_498,
             msg_24);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_21,&R1L);
  str_04._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_04._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_04._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_04._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_04._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_04._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_04._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_04._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  str_04._M_len._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[9];
  str_04._M_len._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[8];
  str_04._M_len._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[10];
  str_04._M_len._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0xb];
  str_04._M_len._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0xc];
  str_04._M_len._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0xd];
  str_04._M_len._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0xe];
  str_04._M_len._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0xf];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_04);
  auVar63[0] = -(DAT_013c7471 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar63[1] = -(uRam00000000013c7472 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar63[2] = -(uRam00000000013c7473 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar63[3] = -(uRam00000000013c7474 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar63[4] = -(uRam00000000013c7475 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar63[5] = -(uRam00000000013c7476 == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar63[6] = -(uRam00000000013c7477 == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar63[7] = -(uRam00000000013c7478 == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar63[8] = -(uRam00000000013c7479 == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar63[9] = -(uRam00000000013c747a == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar63[10] = -(uRam00000000013c747b == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar63[0xb] = -(uRam00000000013c747c == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar63[0xc] = -(uRam00000000013c747d == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar63[0xd] = -(uRam00000000013c747e == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar63[0xe] = -(uRam00000000013c747f == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar63[0xf] = -(DAT_013c7480 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar32[0] = -(R1L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar32[1] = -(uRam00000000013c7462 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar32[2] = -(uRam00000000013c7463 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar32[3] = -(uRam00000000013c7464 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar32[4] = -(uRam00000000013c7465 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar32[5] = -(uRam00000000013c7466 == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar32[6] = -(uRam00000000013c7467 == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar32[7] = -(uRam00000000013c7468 == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar32[8] = -(uRam00000000013c7469 == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar32[9] = -(uRam00000000013c746a == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar32[10] = -(uRam00000000013c746b == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar32[0xb] = -(uRam00000000013c746c == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar32[0xc] = -(uRam00000000013c746d == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar32[0xd] = -(uRam00000000013c746e == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar32[0xe] = -(uRam00000000013c746f == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar32[0xf] = -(uRam00000000013c7470 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar32 = auVar32 & auVar63;
  rv_17.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv.super_base_blob<256U>;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv.super_base_blob<256U> >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x10)
  ;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x18)
  ;
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x20)
  ;
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x28)
  ;
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x30)
  ;
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x38)
  ;
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (string *)&R1L;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_e0 = &rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf717d8,(size_t)&rv_12,100,&local_f8
             ,"R1L",&local_118);
  puVar1 = rv_17.super_base_blob<160U>.m_data._M_elems + 0x10;
  boost::detail::shared_count::~shared_count((shared_count *)puVar1);
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x65;
  file_25.m_begin = (iterator)&local_4a8;
  msg_25.m_end = pvVar25;
  msg_25.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_4b8,
             msg_25);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_12,&R1L);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_12,0
                       ,0,"   0x",5);
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  uVar11 = rv_17.super_base_blob<160U>.m_data._M_elems[0];
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  uVar12 = rv_17.super_base_blob<160U>.m_data._M_elems[1];
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  uVar13 = rv_17.super_base_blob<160U>.m_data._M_elems[2];
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  uVar14 = rv_17.super_base_blob<160U>.m_data._M_elems[3];
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  uVar15 = rv_17.super_base_blob<160U>.m_data._M_elems[4];
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  uVar16 = rv_17.super_base_blob<160U>.m_data._M_elems[5];
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  uVar17 = rv_17.super_base_blob<160U>.m_data._M_elems[6];
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  uVar18 = rv_17.super_base_blob<160U>.m_data._M_elems[7];
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_a4 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_17.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_17.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_17.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_17.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_17.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_17.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_17.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_a4 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,
                       "   ");
  puVar2 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar2;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_05._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_05._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_05._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_05._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_05._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_05._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_05._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_05._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_05._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_05);
  auVar64[0] = -(DAT_013c7471 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar64[1] = -(uRam00000000013c7472 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar64[2] = -(uRam00000000013c7473 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar64[3] = -(uRam00000000013c7474 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar64[4] = -(uRam00000000013c7475 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar64[5] = -(uRam00000000013c7476 == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar64[6] = -(uRam00000000013c7477 == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar64[7] = -(uRam00000000013c7478 == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar64[8] = -(uRam00000000013c7479 == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar64[9] = -(uRam00000000013c747a == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar64[10] = -(uRam00000000013c747b == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar64[0xb] = -(uRam00000000013c747c == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar64[0xc] = -(uRam00000000013c747d == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar64[0xd] = -(uRam00000000013c747e == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar64[0xe] = -(uRam00000000013c747f == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar64[0xf] = -(DAT_013c7480 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar33[0] = -(R1L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar33[1] = -(uRam00000000013c7462 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar33[2] = -(uRam00000000013c7463 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar33[3] = -(uRam00000000013c7464 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar33[4] = -(uRam00000000013c7465 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar33[5] = -(uRam00000000013c7466 == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar33[6] = -(uRam00000000013c7467 == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar33[7] = -(uRam00000000013c7468 == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar33[8] = -(uRam00000000013c7469 == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar33[9] = -(uRam00000000013c746a == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar33[10] = -(uRam00000000013c746b == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar33[0xb] = -(uRam00000000013c746c == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar33[0xc] = -(uRam00000000013c746d == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar33[0xd] = -(uRam00000000013c746e == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar33[0xe] = -(uRam00000000013c746f == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar33[0xf] = -(uRam00000000013c7470 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar33 = auVar33 & auVar64;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff;
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_128 = (string *)0xf715e0;
  local_120 = "";
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_130;
  local_100 = (uint160 *)&local_138;
  local_138 = &R1L;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_130 = &rv.super_base_blob<256U>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_18,&local_178,1,2,REQUIRE,0xf717f1,(size_t)&local_128,0x65,
             &local_f8,"R1L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_18.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,CONCAT44(uStack_a4,rv_17.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_12.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_12.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_12.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_12.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_12.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_12.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_12.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_12.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_12.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_12.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x66;
  file_26.m_begin = (iterator)&local_4c8;
  msg_26.m_end = pvVar25;
  msg_26.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_4d8,
             msg_26);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_12,&R1L);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_12,0
                       ,0,"   0x",5);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_a4 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = uVar11;
    rv_17.super_base_blob<160U>.m_data._M_elems[1] = uVar12;
    rv_17.super_base_blob<160U>.m_data._M_elems[2] = uVar13;
    rv_17.super_base_blob<160U>.m_data._M_elems[3] = uVar14;
    rv_17.super_base_blob<160U>.m_data._M_elems[4] = uVar15;
    rv_17.super_base_blob<160U>.m_data._M_elems[5] = uVar16;
    rv_17.super_base_blob<160U>.m_data._M_elems[6] = uVar17;
    rv_17.super_base_blob<160U>.m_data._M_elems[7] = uVar18;
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_17.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_17.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_17.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_17.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_17.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_17.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_17.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_a4 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,
                       "-trash;%^&   ");
  puVar2 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar2;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_06._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_06._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_06._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_06._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_06._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_06._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_06._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_06._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_06._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_06);
  auVar65[0] = -(DAT_013c7471 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar65[1] = -(uRam00000000013c7472 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar65[2] = -(uRam00000000013c7473 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar65[3] = -(uRam00000000013c7474 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar65[4] = -(uRam00000000013c7475 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar65[5] = -(uRam00000000013c7476 == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar65[6] = -(uRam00000000013c7477 == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar65[7] = -(uRam00000000013c7478 == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar65[8] = -(uRam00000000013c7479 == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar65[9] = -(uRam00000000013c747a == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar65[10] = -(uRam00000000013c747b == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar65[0xb] = -(uRam00000000013c747c == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar65[0xc] = -(uRam00000000013c747d == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar65[0xd] = -(uRam00000000013c747e == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar65[0xe] = -(uRam00000000013c747f == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar65[0xf] = -(DAT_013c7480 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar34[0] = -(R1L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar34[1] = -(uRam00000000013c7462 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar34[2] = -(uRam00000000013c7463 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar34[3] = -(uRam00000000013c7464 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar34[4] = -(uRam00000000013c7465 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar34[5] = -(uRam00000000013c7466 == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar34[6] = -(uRam00000000013c7467 == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar34[7] = -(uRam00000000013c7468 == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar34[8] = -(uRam00000000013c7469 == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar34[9] = -(uRam00000000013c746a == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar34[10] = -(uRam00000000013c746b == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar34[0xb] = -(uRam00000000013c746c == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar34[0xc] = -(uRam00000000013c746d == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar34[0xd] = -(uRam00000000013c746e == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar34[0xe] = -(uRam00000000013c746f == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar34[0xf] = -(uRam00000000013c7470 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar34 = auVar34 & auVar65;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff;
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_128 = (string *)0xf715e0;
  local_120 = "";
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_130;
  local_138 = &R1L;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_138;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_130 = &rv.super_base_blob<256U>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_18,&local_178,1,2,REQUIRE,0xf71826,(size_t)&local_128,0x66,
             &local_f8,"R1L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_18.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,CONCAT44(uStack_a4,rv_17.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_12.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_12.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_12.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_12.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_12.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_12.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_12.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_12.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_12.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_12.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x67;
  file_27.m_begin = (iterator)&local_4e8;
  msg_27.m_end = pvVar25;
  msg_27.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_4f8,
             msg_27);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&rv_12,&R1L);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_12,0
                       ,0,"\t \n  \n \f\n\r\t\v\t   0x",0x12);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_a4 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = uVar11;
    rv_17.super_base_blob<160U>.m_data._M_elems[1] = uVar12;
    rv_17.super_base_blob<160U>.m_data._M_elems[2] = uVar13;
    rv_17.super_base_blob<160U>.m_data._M_elems[3] = uVar14;
    rv_17.super_base_blob<160U>.m_data._M_elems[4] = uVar15;
    rv_17.super_base_blob<160U>.m_data._M_elems[5] = uVar16;
    rv_17.super_base_blob<160U>.m_data._M_elems[6] = uVar17;
    rv_17.super_base_blob<160U>.m_data._M_elems[7] = uVar18;
  }
  else {
    rv_17.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_17.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_17.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_17.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_17.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_17.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_17.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_17.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_a4 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,
                       "  \t \n  \n \f\n\r\t\v\t ");
  puVar2 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar2;
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_07._M_str._1_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  str_07._M_str._0_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  str_07._M_str._2_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  str_07._M_str._3_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  str_07._M_str._4_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  str_07._M_str._5_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  str_07._M_str._6_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  str_07._M_str._7_1_ = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_07._M_len = sVar6;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_07);
  auVar66[0] = -(DAT_013c7471 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar66[1] = -(uRam00000000013c7472 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar66[2] = -(uRam00000000013c7473 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar66[3] = -(uRam00000000013c7474 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar66[4] = -(uRam00000000013c7475 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar66[5] = -(uRam00000000013c7476 == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar66[6] = -(uRam00000000013c7477 == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar66[7] = -(uRam00000000013c7478 == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar66[8] = -(uRam00000000013c7479 == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar66[9] = -(uRam00000000013c747a == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar66[10] = -(uRam00000000013c747b == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar66[0xb] = -(uRam00000000013c747c == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar66[0xc] = -(uRam00000000013c747d == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar66[0xd] = -(uRam00000000013c747e == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar66[0xe] = -(uRam00000000013c747f == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar66[0xf] = -(DAT_013c7480 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar35[0] = -(R1L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar35[1] = -(uRam00000000013c7462 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar35[2] = -(uRam00000000013c7463 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar35[3] = -(uRam00000000013c7464 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar35[4] = -(uRam00000000013c7465 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar35[5] = -(uRam00000000013c7466 == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar35[6] = -(uRam00000000013c7467 == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar35[7] = -(uRam00000000013c7468 == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar35[8] = -(uRam00000000013c7469 == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar35[9] = -(uRam00000000013c746a == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar35[10] = -(uRam00000000013c746b == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar35[0xb] = -(uRam00000000013c746c == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar35[0xc] = -(uRam00000000013c746d == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar35[0xd] = -(uRam00000000013c746e == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar35[0xe] = -(uRam00000000013c746f == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar35[0xf] = -(uRam00000000013c7470 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar35 = auVar35 & auVar66;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff;
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_128 = (string *)0xf715e0;
  local_120 = "";
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_130;
  local_138 = &R1L;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_138;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_130 = &rv.super_base_blob<256U>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_18,&local_178,1,2,REQUIRE,0xf7187b,(size_t)&local_128,0x67,
             &local_f8,"R1L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_18.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_21.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,CONCAT44(uStack_a4,rv_17.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  puVar8 = (undefined1 *)
           CONCAT17(rv_12.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_12.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_12.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_12.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_12.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_12.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_12.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_12.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (puVar8 != rv_12.super_base_blob<160U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,(ulong)(uint)rv_12.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = &DAT_00000068;
  file_28.m_begin = (iterator)&local_508;
  msg_28.m_end = pvVar25;
  msg_28.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_518,
             msg_28);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  base_blob<256U>::SetHexDeprecated
            (&rv.super_base_blob<256U>,(string_view)(ZEXT816(0xf73bdc) << 0x40));
  auVar67[0] = -(ZeroL[0x10] == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar67[1] = -(ZeroL[0x11] == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar67[2] = -(ZeroL[0x12] == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar67[3] = -(ZeroL[0x13] == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar67[4] = -(ZeroL[0x14] == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar67[5] = -(ZeroL[0x15] == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar67[6] = -(ZeroL[0x16] == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar67[7] = -(ZeroL[0x17] == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar67[8] = -(ZeroL[0x18] == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar67[9] = -(ZeroL[0x19] == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar67[10] = -(ZeroL[0x1a] == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar67[0xb] = -(ZeroL[0x1b] == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar67[0xc] = -(ZeroL[0x1c] == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar67[0xd] = -(ZeroL[0x1d] == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar67[0xe] = -(ZeroL[0x1e] == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar67[0xf] = -(ZeroL[0x1f] == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar36[0] = -(ZeroL[0] == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar36[1] = -(ZeroL[1] == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar36[2] = -(ZeroL[2] == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar36[3] = -(ZeroL[3] == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar36[4] = -(ZeroL[4] == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar36[5] = -(ZeroL[5] == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar36[6] = -(ZeroL[6] == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar36[7] = -(ZeroL[7] == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar36[8] = -(ZeroL[8] == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar36[9] = -(ZeroL[9] == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar36[10] = -(ZeroL[10] == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar36[0xb] = -(ZeroL[0xb] == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar36[0xc] = -(ZeroL[0xc] == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar36[0xd] = -(ZeroL[0xd] == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar36[0xe] = -(ZeroL[0xe] == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar36[0xf] = -(ZeroL[0xf] == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar36 = auVar36 & auVar67;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) == 0xffff;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv.super_base_blob<256U>;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv.super_base_blob<256U> >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x10)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x18)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x20)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x28)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x30)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x38)
  ;
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xc9;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_e0 = &rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xf718ce,(size_t)&rv_17,0x68,
             &local_f8,"ZeroL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_21.super_base_blob<160U>.m_data._M_elems + 0x10));
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x69;
  file_29.m_begin = (iterator)&local_528;
  msg_29.m_end = pvVar25;
  msg_29.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_538,
             msg_29);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  str_08._M_str = "1";
  str_08._M_len = 1;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_08);
  auVar68[0] = -(OneL[0x10] == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar68[1] = -(OneL[0x11] == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar68[2] = -(OneL[0x12] == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar68[3] = -(OneL[0x13] == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar68[4] = -(OneL[0x14] == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar68[5] = -(OneL[0x15] == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar68[6] = -(OneL[0x16] == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar68[7] = -(OneL[0x17] == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar68[8] = -(OneL[0x18] == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar68[9] = -(OneL[0x19] == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar68[10] = -(OneL[0x1a] == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar68[0xb] = -(OneL[0x1b] == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar68[0xc] = -(OneL[0x1c] == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar68[0xd] = -(OneL[0x1d] == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar68[0xe] = -(OneL[0x1e] == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar68[0xf] = -(OneL[0x1f] == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar37[0] = -(OneL[0] == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar37[1] = -(OneL[1] == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar37[2] = -(OneL[2] == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar37[3] = -(OneL[3] == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar37[4] = -(OneL[4] == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar37[5] = -(OneL[5] == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar37[6] = -(OneL[6] == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar37[7] = -(OneL[7] == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar37[8] = -(OneL[8] == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar37[9] = -(OneL[9] == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar37[10] = -(OneL[10] == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar37[0xb] = -(OneL[0xb] == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar37[0xc] = -(OneL[0xc] == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar37[0xd] = -(OneL[0xd] == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar37[0xe] = -(OneL[0xe] == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar37[0xf] = -(OneL[0xf] == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar37 = auVar37 & auVar68;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) == 0xffff;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv.super_base_blob<256U>;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv.super_base_blob<256U> >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x10)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x18)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x20)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x28)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x30)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv.super_base_blob<256U> >> 0x38)
  ;
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xfd;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_100 = &rv_18;
  local_e0 = &rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xf718db,(size_t)&rv_17,0x69,
             &local_f8,"OneL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_21.super_base_blob<160U>.m_data._M_elems + 0x10));
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x6a;
  file_30.m_begin = (iterator)&local_548;
  msg_30.m_end = pvVar25;
  msg_30.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_558,
             msg_30);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  str_09._M_str = R1ArrayHex;
  str_09._M_len = 0x40;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_09);
  auVar69[0] = -(DAT_013c7471 == rv.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar69[1] = -(uRam00000000013c7472 == rv.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar69[2] = -(uRam00000000013c7473 == rv.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar69[3] = -(uRam00000000013c7474 == rv.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar69[4] = -(uRam00000000013c7475 == rv.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar69[5] = -(uRam00000000013c7476 == rv.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar69[6] = -(uRam00000000013c7477 == rv.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar69[7] = -(uRam00000000013c7478 == rv.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar69[8] = -(uRam00000000013c7479 == rv.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar69[9] = -(uRam00000000013c747a == rv.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar69[10] = -(uRam00000000013c747b == rv.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar69[0xb] = -(uRam00000000013c747c == rv.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar69[0xc] = -(uRam00000000013c747d == rv.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar69[0xd] = -(uRam00000000013c747e == rv.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar69[0xe] = -(uRam00000000013c747f == rv.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar69[0xf] = -(DAT_013c7480 == rv.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar38[0] = -(R1L == rv.super_base_blob<256U>.m_data._M_elems[0]);
  auVar38[1] = -(uRam00000000013c7462 == rv.super_base_blob<256U>.m_data._M_elems[1]);
  auVar38[2] = -(uRam00000000013c7463 == rv.super_base_blob<256U>.m_data._M_elems[2]);
  auVar38[3] = -(uRam00000000013c7464 == rv.super_base_blob<256U>.m_data._M_elems[3]);
  auVar38[4] = -(uRam00000000013c7465 == rv.super_base_blob<256U>.m_data._M_elems[4]);
  auVar38[5] = -(uRam00000000013c7466 == rv.super_base_blob<256U>.m_data._M_elems[5]);
  auVar38[6] = -(uRam00000000013c7467 == rv.super_base_blob<256U>.m_data._M_elems[6]);
  auVar38[7] = -(uRam00000000013c7468 == rv.super_base_blob<256U>.m_data._M_elems[7]);
  auVar38[8] = -(uRam00000000013c7469 == rv.super_base_blob<256U>.m_data._M_elems[8]);
  auVar38[9] = -(uRam00000000013c746a == rv.super_base_blob<256U>.m_data._M_elems[9]);
  auVar38[10] = -(uRam00000000013c746b == rv.super_base_blob<256U>.m_data._M_elems[10]);
  auVar38[0xb] = -(uRam00000000013c746c == rv.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar38[0xc] = -(uRam00000000013c746d == rv.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar38[0xd] = -(uRam00000000013c746e == rv.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar38[0xe] = -(uRam00000000013c746f == rv.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar38[0xf] = -(uRam00000000013c7470 == rv.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar38 = auVar38 & auVar69;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) == 0xffff;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  builtin_memcpy(rv_12.super_base_blob<160U>.m_data._M_elems,"at<\x01",5);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_100 = &rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xe622fa,(size_t)&rv_17,0x6a,
             &local_f8,"uint256S(R1ArrayHex)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_21.super_base_blob<160U>.m_data._M_elems + 0x10));
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x6b;
  file_31.m_begin = (iterator)&local_568;
  msg_31.m_end = pvVar25;
  msg_31.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_578,
             msg_31);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = DAT_013c7471;
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = uRam00000000013c7472;
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = uRam00000000013c7473;
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = uRam00000000013c7474;
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = uRam00000000013c7475;
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = uRam00000000013c7476;
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = uRam00000000013c7477;
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = uRam00000000013c7478;
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = uRam00000000013c7479;
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = uRam00000000013c747a;
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = uRam00000000013c747b;
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = uRam00000000013c747c;
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = uRam00000000013c747d;
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = uRam00000000013c747e;
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = uRam00000000013c747f;
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = DAT_013c7480;
  rv.super_base_blob<256U>.m_data._M_elems[0] = R1L;
  rv.super_base_blob<256U>.m_data._M_elems[1] = uRam00000000013c7462;
  rv.super_base_blob<256U>.m_data._M_elems[2] = uRam00000000013c7463;
  rv.super_base_blob<256U>.m_data._M_elems[3] = uRam00000000013c7464;
  rv.super_base_blob<256U>.m_data._M_elems[4] = uRam00000000013c7465;
  rv.super_base_blob<256U>.m_data._M_elems[5] = uRam00000000013c7466;
  rv.super_base_blob<256U>.m_data._M_elems[6] = uRam00000000013c7467;
  rv.super_base_blob<256U>.m_data._M_elems[7] = uRam00000000013c7468;
  rv.super_base_blob<256U>.m_data._M_elems[8] = uRam00000000013c7469;
  rv.super_base_blob<256U>.m_data._M_elems[9] = uRam00000000013c746a;
  rv.super_base_blob<256U>.m_data._M_elems[10] = uRam00000000013c746b;
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = uRam00000000013c746c;
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = uRam00000000013c746d;
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = uRam00000000013c746e;
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = uRam00000000013c746f;
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = uRam00000000013c7470;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = '\x01';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  builtin_memcpy(rv_18.super_base_blob<160U>.m_data._M_elems,"at<\x01",5);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xf718e9,(size_t)&rv_17,0x6b,
             &local_f8,"R1L",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_21.super_base_blob<160U>.m_data._M_elems + 0x10));
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x6c;
  file_32.m_begin = (iterator)&local_588;
  msg_32.m_end = pvVar25;
  msg_32.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_598,
             msg_32);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = ZeroL[0x10];
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = ZeroL[0x11];
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = ZeroL[0x12];
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = ZeroL[0x13];
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = ZeroL[0x14];
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = ZeroL[0x15];
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = ZeroL[0x16];
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = ZeroL[0x17];
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = ZeroL[0x18];
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = ZeroL[0x19];
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = ZeroL[0x1a];
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = ZeroL[0x1b];
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = ZeroL[0x1c];
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = ZeroL[0x1d];
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = ZeroL[0x1e];
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = ZeroL[0x1f];
  rv.super_base_blob<256U>.m_data._M_elems[0] = ZeroL[0];
  rv.super_base_blob<256U>.m_data._M_elems[1] = ZeroL[1];
  rv.super_base_blob<256U>.m_data._M_elems[2] = ZeroL[2];
  rv.super_base_blob<256U>.m_data._M_elems[3] = ZeroL[3];
  rv.super_base_blob<256U>.m_data._M_elems[4] = ZeroL[4];
  rv.super_base_blob<256U>.m_data._M_elems[5] = ZeroL[5];
  rv.super_base_blob<256U>.m_data._M_elems[6] = ZeroL[6];
  rv.super_base_blob<256U>.m_data._M_elems[7] = ZeroL[7];
  rv.super_base_blob<256U>.m_data._M_elems[8] = ZeroL[8];
  rv.super_base_blob<256U>.m_data._M_elems[9] = ZeroL[9];
  rv.super_base_blob<256U>.m_data._M_elems[10] = ZeroL[10];
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = ZeroL[0xb];
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = ZeroL[0xc];
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = ZeroL[0xd];
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = ZeroL[0xe];
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = ZeroL[0xf];
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = '\x01';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xc9;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xf718f6,(size_t)&rv_17,0x6c,
             &local_f8,"ZeroL",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_21.super_base_blob<160U>.m_data._M_elems + 0x10));
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x6d;
  file_33.m_begin = (iterator)&local_5a8;
  msg_33.m_end = pvVar25;
  msg_33.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_5b8,
             msg_33);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = OneL[0x10];
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = OneL[0x11];
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = OneL[0x12];
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = OneL[0x13];
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = OneL[0x14];
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = OneL[0x15];
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = OneL[0x16];
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = OneL[0x17];
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = OneL[0x18];
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = OneL[0x19];
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = OneL[0x1a];
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = OneL[0x1b];
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = OneL[0x1c];
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = OneL[0x1d];
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = OneL[0x1e];
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = OneL[0x1f];
  rv.super_base_blob<256U>.m_data._M_elems[0] = OneL[0];
  rv.super_base_blob<256U>.m_data._M_elems[1] = OneL[1];
  rv.super_base_blob<256U>.m_data._M_elems[2] = OneL[2];
  rv.super_base_blob<256U>.m_data._M_elems[3] = OneL[3];
  rv.super_base_blob<256U>.m_data._M_elems[4] = OneL[4];
  rv.super_base_blob<256U>.m_data._M_elems[5] = OneL[5];
  rv.super_base_blob<256U>.m_data._M_elems[6] = OneL[6];
  rv.super_base_blob<256U>.m_data._M_elems[7] = OneL[7];
  rv.super_base_blob<256U>.m_data._M_elems[8] = OneL[8];
  rv.super_base_blob<256U>.m_data._M_elems[9] = OneL[9];
  rv.super_base_blob<256U>.m_data._M_elems[10] = OneL[10];
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = OneL[0xb];
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = OneL[0xc];
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = OneL[0xd];
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = OneL[0xe];
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = OneL[0xf];
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = '\x01';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013aed38;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xfd;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013aed38;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xf71905,(size_t)&rv_17,0x6d,
             &local_f8,"OneL",&local_118);
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  boost::detail::shared_count::~shared_count((shared_count *)puVar1);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x6f;
  file_34.m_begin = (iterator)&local_5c8;
  msg_34.m_end = pvVar25;
  msg_34.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_5d8,
             msg_34);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_21,R1S);
  puVar2 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,0
                       ,0,"0x",2);
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar2;
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_10._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_10._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_10._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_10._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_10._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_10._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_10._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_10._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_10._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_12,str_10);
  auVar39[0] = -(R1S[0] == rv_12.super_base_blob<160U>.m_data._M_elems[0]);
  auVar39[1] = -(R1S[1] == rv_12.super_base_blob<160U>.m_data._M_elems[1]);
  auVar39[2] = -(R1S[2] == rv_12.super_base_blob<160U>.m_data._M_elems[2]);
  auVar39[3] = -(R1S[3] == rv_12.super_base_blob<160U>.m_data._M_elems[3]);
  auVar39[4] = -(R1S[4] == rv_12.super_base_blob<160U>.m_data._M_elems[4]);
  auVar39[5] = -(R1S[5] == rv_12.super_base_blob<160U>.m_data._M_elems[5]);
  auVar39[6] = -(R1S[6] == rv_12.super_base_blob<160U>.m_data._M_elems[6]);
  auVar39[7] = -(R1S[7] == rv_12.super_base_blob<160U>.m_data._M_elems[7]);
  auVar39[8] = -(R1S[8] == rv_12.super_base_blob<160U>.m_data._M_elems[8]);
  auVar39[9] = -(R1S[9] == rv_12.super_base_blob<160U>.m_data._M_elems[9]);
  auVar39[10] = -(R1S[10] == rv_12.super_base_blob<160U>.m_data._M_elems[10]);
  auVar39[0xb] = -(R1S[0xb] == rv_12.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar39[0xc] = -(R1S[0xc] == rv_12.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar39[0xd] = -(R1S[0xd] == rv_12.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar39[0xe] = -(R1S[0xe] == rv_12.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar39[0xf] = -(R1S[0xf] == rv_12.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar78[0] = -(R1S[0x10] == rv_12.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar78[1] = -(R1S[0x11] == rv_12.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar78[2] = -(R1S[0x12] == rv_12.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar78[3] = -(R1S[0x13] == rv_12.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar78[4] = 0xff;
  auVar78[5] = 0xff;
  auVar78[6] = 0xff;
  auVar78[7] = 0xff;
  auVar78[8] = 0xff;
  auVar78[9] = 0xff;
  auVar78[10] = 0xff;
  auVar78[0xb] = 0xff;
  auVar78[0xc] = 0xff;
  auVar78[0xd] = 0xff;
  auVar78[0xe] = 0xff;
  auVar78[0xf] = 0xff;
  auVar39 = auVar39 & auVar78;
  rv_17.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) == 0xffff;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)R1S;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf71913,(size_t)&rv_18,0x6f,
             &local_f8,"R1S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  puVar2 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (puVar8 != puVar2) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,(ulong)(uint)rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x70;
  file_35.m_begin = (iterator)&local_5e8;
  msg_35.m_end = pvVar25;
  msg_35.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_5f8,
             msg_35);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_21,R2S);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,0
                       ,0,"0x",2);
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar2;
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_11._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_11._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_11._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_11._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_11._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_11._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_11._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_11._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_11._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_12,str_11);
  auVar40[0] = -(R2S[0] == rv_12.super_base_blob<160U>.m_data._M_elems[0]);
  auVar40[1] = -(R2S[1] == rv_12.super_base_blob<160U>.m_data._M_elems[1]);
  auVar40[2] = -(R2S[2] == rv_12.super_base_blob<160U>.m_data._M_elems[2]);
  auVar40[3] = -(R2S[3] == rv_12.super_base_blob<160U>.m_data._M_elems[3]);
  auVar40[4] = -(R2S[4] == rv_12.super_base_blob<160U>.m_data._M_elems[4]);
  auVar40[5] = -(R2S[5] == rv_12.super_base_blob<160U>.m_data._M_elems[5]);
  auVar40[6] = -(R2S[6] == rv_12.super_base_blob<160U>.m_data._M_elems[6]);
  auVar40[7] = -(R2S[7] == rv_12.super_base_blob<160U>.m_data._M_elems[7]);
  auVar40[8] = -(R2S[8] == rv_12.super_base_blob<160U>.m_data._M_elems[8]);
  auVar40[9] = -(R2S[9] == rv_12.super_base_blob<160U>.m_data._M_elems[9]);
  auVar40[10] = -(R2S[10] == rv_12.super_base_blob<160U>.m_data._M_elems[10]);
  auVar40[0xb] = -(R2S[0xb] == rv_12.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar40[0xc] = -(R2S[0xc] == rv_12.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar40[0xd] = -(R2S[0xd] == rv_12.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar40[0xe] = -(R2S[0xe] == rv_12.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar40[0xf] = -(R2S[0xf] == rv_12.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar79[0] = -(R2S[0x10] == rv_12.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar79[1] = -(R2S[0x11] == rv_12.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar79[2] = -(R2S[0x12] == rv_12.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar79[3] = -(R2S[0x13] == rv_12.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar79[4] = 0xff;
  auVar79[5] = 0xff;
  auVar79[6] = 0xff;
  auVar79[7] = 0xff;
  auVar79[8] = 0xff;
  auVar79[9] = 0xff;
  auVar79[10] = 0xff;
  auVar79[0xb] = 0xff;
  auVar79[0xc] = 0xff;
  auVar79[0xd] = 0xff;
  auVar79[0xe] = 0xff;
  auVar79[0xf] = 0xff;
  auVar40 = auVar40 & auVar79;
  rv_17.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)R2S;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf71931,(size_t)&rv_18,0x70,
             &local_f8,"R2S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  puVar2 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (puVar8 != puVar2) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,(ulong)(uint)rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x71;
  file_36.m_begin = (iterator)&local_608;
  msg_36.m_end = pvVar25;
  msg_36.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_618,
             msg_36);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_21,ZeroS);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,0
                       ,0,"0x",2);
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar2;
  uVar11 = rv.super_base_blob<256U>.m_data._M_elems[0];
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  uVar12 = rv.super_base_blob<256U>.m_data._M_elems[1];
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  uVar13 = rv.super_base_blob<256U>.m_data._M_elems[2];
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  uVar14 = rv.super_base_blob<256U>.m_data._M_elems[3];
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  uVar15 = rv.super_base_blob<256U>.m_data._M_elems[4];
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  uVar16 = rv.super_base_blob<256U>.m_data._M_elems[5];
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  uVar17 = rv.super_base_blob<256U>.m_data._M_elems[6];
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  uVar18 = rv.super_base_blob<256U>.m_data._M_elems[7];
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_12._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_12._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_12._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_12._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_12._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_12._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_12._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_12._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_12._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_12,str_12);
  auVar41[0] = -(ZeroS[0] == rv_12.super_base_blob<160U>.m_data._M_elems[0]);
  auVar41[1] = -(ZeroS[1] == rv_12.super_base_blob<160U>.m_data._M_elems[1]);
  auVar41[2] = -(ZeroS[2] == rv_12.super_base_blob<160U>.m_data._M_elems[2]);
  auVar41[3] = -(ZeroS[3] == rv_12.super_base_blob<160U>.m_data._M_elems[3]);
  auVar41[4] = -(ZeroS[4] == rv_12.super_base_blob<160U>.m_data._M_elems[4]);
  auVar41[5] = -(ZeroS[5] == rv_12.super_base_blob<160U>.m_data._M_elems[5]);
  auVar41[6] = -(ZeroS[6] == rv_12.super_base_blob<160U>.m_data._M_elems[6]);
  auVar41[7] = -(ZeroS[7] == rv_12.super_base_blob<160U>.m_data._M_elems[7]);
  auVar41[8] = -(ZeroS[8] == rv_12.super_base_blob<160U>.m_data._M_elems[8]);
  auVar41[9] = -(ZeroS[9] == rv_12.super_base_blob<160U>.m_data._M_elems[9]);
  auVar41[10] = -(ZeroS[10] == rv_12.super_base_blob<160U>.m_data._M_elems[10]);
  auVar41[0xb] = -(ZeroS[0xb] == rv_12.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar41[0xc] = -(ZeroS[0xc] == rv_12.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar41[0xd] = -(ZeroS[0xd] == rv_12.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar41[0xe] = -(ZeroS[0xe] == rv_12.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar41[0xf] = -(ZeroS[0xf] == rv_12.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar80[0] = -(ZeroS[0x10] == rv_12.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar80[1] = -(ZeroS[0x11] == rv_12.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar80[2] = -(ZeroS[0x12] == rv_12.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar80[3] = -(ZeroS[0x13] == rv_12.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar80[4] = 0xff;
  auVar80[5] = 0xff;
  auVar80[6] = 0xff;
  auVar80[7] = 0xff;
  auVar80[8] = 0xff;
  auVar80[9] = 0xff;
  auVar80[10] = 0xff;
  auVar80[0xb] = 0xff;
  auVar80[0xc] = 0xff;
  auVar80[0xd] = 0xff;
  auVar80[0xe] = 0xff;
  auVar80[0xf] = 0xff;
  auVar41 = auVar41 & auVar80;
  rv_17.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)ZeroS;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf7194f,(size_t)&rv_18,0x71,
             &local_f8,"ZeroS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != puVar2) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,(ulong)(uint)rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x72;
  file_37.m_begin = (iterator)&local_628;
  msg_37.m_end = pvVar25;
  msg_37.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_638,
             msg_37);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_21,OneS);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,0
                       ,0,"0x",2);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0] = uVar11;
    rv.super_base_blob<256U>.m_data._M_elems[1] = uVar12;
    rv.super_base_blob<256U>.m_data._M_elems[2] = uVar13;
    rv.super_base_blob<256U>.m_data._M_elems[3] = uVar14;
    rv.super_base_blob<256U>.m_data._M_elems[4] = uVar15;
    rv.super_base_blob<256U>.m_data._M_elems[5] = uVar16;
    rv.super_base_blob<256U>.m_data._M_elems[6] = uVar17;
    rv.super_base_blob<256U>.m_data._M_elems[7] = uVar18;
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_13._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_13._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_13._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_13._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_13._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_13._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_13._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_13._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_13._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_12,str_13);
  auVar42[0] = -(OneS[0] == rv_12.super_base_blob<160U>.m_data._M_elems[0]);
  auVar42[1] = -(OneS[1] == rv_12.super_base_blob<160U>.m_data._M_elems[1]);
  auVar42[2] = -(OneS[2] == rv_12.super_base_blob<160U>.m_data._M_elems[2]);
  auVar42[3] = -(OneS[3] == rv_12.super_base_blob<160U>.m_data._M_elems[3]);
  auVar42[4] = -(OneS[4] == rv_12.super_base_blob<160U>.m_data._M_elems[4]);
  auVar42[5] = -(OneS[5] == rv_12.super_base_blob<160U>.m_data._M_elems[5]);
  auVar42[6] = -(OneS[6] == rv_12.super_base_blob<160U>.m_data._M_elems[6]);
  auVar42[7] = -(OneS[7] == rv_12.super_base_blob<160U>.m_data._M_elems[7]);
  auVar42[8] = -(OneS[8] == rv_12.super_base_blob<160U>.m_data._M_elems[8]);
  auVar42[9] = -(OneS[9] == rv_12.super_base_blob<160U>.m_data._M_elems[9]);
  auVar42[10] = -(OneS[10] == rv_12.super_base_blob<160U>.m_data._M_elems[10]);
  auVar42[0xb] = -(OneS[0xb] == rv_12.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar42[0xc] = -(OneS[0xc] == rv_12.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar42[0xd] = -(OneS[0xd] == rv_12.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar42[0xe] = -(OneS[0xe] == rv_12.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar42[0xf] = -(OneS[0xf] == rv_12.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar81[0] = -(OneS[0x10] == rv_12.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar81[1] = -(OneS[0x11] == rv_12.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar81[2] = -(OneS[0x12] == rv_12.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar81[3] = -(OneS[0x13] == rv_12.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar81[4] = 0xff;
  auVar81[5] = 0xff;
  auVar81[6] = 0xff;
  auVar81[7] = 0xff;
  auVar81[8] = 0xff;
  auVar81[9] = 0xff;
  auVar81[10] = 0xff;
  auVar81[0xb] = 0xff;
  auVar81[0xc] = 0xff;
  auVar81[0xd] = 0xff;
  auVar81[0xe] = 0xff;
  auVar81[0xf] = 0xff;
  auVar42 = auVar42 & auVar81;
  rv_17.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) | (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) == 0xffff;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)OneS;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf7196f,(size_t)&rv_18,0x72,
             &local_f8,"OneS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_17.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != puVar2) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,(ulong)(uint)rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x73;
  file_38.m_begin = (iterator)&local_648;
  msg_38.m_end = pvVar25;
  msg_38.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_658,
             msg_38);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_21,MaxS);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,0
                       ,0,"0x",2);
  puVar2 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar2;
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar2 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar2 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar2 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar2 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar2 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar2 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar2 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_14._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_14._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_14._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_14._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_14._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_14._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_14._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_14._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_14._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_12,str_14);
  auVar43[0] = -(MaxS[0] == rv_12.super_base_blob<160U>.m_data._M_elems[0]);
  auVar43[1] = -(MaxS[1] == rv_12.super_base_blob<160U>.m_data._M_elems[1]);
  auVar43[2] = -(MaxS[2] == rv_12.super_base_blob<160U>.m_data._M_elems[2]);
  auVar43[3] = -(MaxS[3] == rv_12.super_base_blob<160U>.m_data._M_elems[3]);
  auVar43[4] = -(MaxS[4] == rv_12.super_base_blob<160U>.m_data._M_elems[4]);
  auVar43[5] = -(MaxS[5] == rv_12.super_base_blob<160U>.m_data._M_elems[5]);
  auVar43[6] = -(MaxS[6] == rv_12.super_base_blob<160U>.m_data._M_elems[6]);
  auVar43[7] = -(MaxS[7] == rv_12.super_base_blob<160U>.m_data._M_elems[7]);
  auVar43[8] = -(MaxS[8] == rv_12.super_base_blob<160U>.m_data._M_elems[8]);
  auVar43[9] = -(MaxS[9] == rv_12.super_base_blob<160U>.m_data._M_elems[9]);
  auVar43[10] = -(MaxS[10] == rv_12.super_base_blob<160U>.m_data._M_elems[10]);
  auVar43[0xb] = -(MaxS[0xb] == rv_12.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar43[0xc] = -(MaxS[0xc] == rv_12.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar43[0xd] = -(MaxS[0xd] == rv_12.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar43[0xe] = -(MaxS[0xe] == rv_12.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar43[0xf] = -(MaxS[0xf] == rv_12.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar82[0] = -(MaxS[0x10] == rv_12.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar82[1] = -(MaxS[0x11] == rv_12.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar82[2] = -(MaxS[0x12] == rv_12.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar82[3] = -(MaxS[0x13] == rv_12.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar82[4] = 0xff;
  auVar82[5] = 0xff;
  auVar82[6] = 0xff;
  auVar82[7] = 0xff;
  auVar82[8] = 0xff;
  auVar82[9] = 0xff;
  auVar82[10] = 0xff;
  auVar82[0xb] = 0xff;
  auVar82[0xc] = 0xff;
  auVar82[0xd] = 0xff;
  auVar82[0xe] = 0xff;
  auVar82[0xf] = 0xff;
  auVar43 = auVar43 & auVar82;
  rv_17.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) == 0xffff;
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_128;
  local_130 = (base_blob<256U> *)MaxS;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_130;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_128 = (string *)&rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_17,&local_178,1,2,REQUIRE,0xf7198e,(size_t)&rv_18,0x73,
             &local_f8,"MaxS",&local_118);
  puVar2 = rv_17.super_base_blob<160U>.m_data._M_elems + 0x10;
  boost::detail::shared_count::~shared_count((shared_count *)puVar2);
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,(ulong)(uint)rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x74;
  file_39.m_begin = (iterator)&local_668;
  msg_39.m_end = pvVar25;
  msg_39.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_678,
             msg_39);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv,R1S);
  str_15._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_15._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_15._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_15._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_15._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_15._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_15._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_15._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  str_15._M_len._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[9];
  str_15._M_len._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[8];
  str_15._M_len._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[10];
  str_15._M_len._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[0xb];
  str_15._M_len._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[0xc];
  str_15._M_len._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[0xd];
  str_15._M_len._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[0xe];
  str_15._M_len._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[0xf];
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  base_blob<160U>::SetHexDeprecated(&rv_17.super_base_blob<160U>,str_15);
  auVar44[0] = -(R1S[0] == rv_17.super_base_blob<160U>.m_data._M_elems[0]);
  auVar44[1] = -(R1S[1] == rv_17.super_base_blob<160U>.m_data._M_elems[1]);
  auVar44[2] = -(R1S[2] == rv_17.super_base_blob<160U>.m_data._M_elems[2]);
  auVar44[3] = -(R1S[3] == rv_17.super_base_blob<160U>.m_data._M_elems[3]);
  auVar44[4] = -(R1S[4] == rv_17.super_base_blob<160U>.m_data._M_elems[4]);
  auVar44[5] = -(R1S[5] == rv_17.super_base_blob<160U>.m_data._M_elems[5]);
  auVar44[6] = -(R1S[6] == rv_17.super_base_blob<160U>.m_data._M_elems[6]);
  auVar44[7] = -(R1S[7] == rv_17.super_base_blob<160U>.m_data._M_elems[7]);
  auVar44[8] = -(R1S[8] == rv_17.super_base_blob<160U>.m_data._M_elems[8]);
  auVar44[9] = -(R1S[9] == rv_17.super_base_blob<160U>.m_data._M_elems[9]);
  auVar44[10] = -(R1S[10] == rv_17.super_base_blob<160U>.m_data._M_elems[10]);
  auVar44[0xb] = -(R1S[0xb] == rv_17.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar44[0xc] = -(R1S[0xc] == rv_17.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar44[0xd] = -(R1S[0xd] == rv_17.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar44[0xe] = -(R1S[0xe] == rv_17.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar44[0xf] = -(R1S[0xf] == rv_17.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar83[0] = -(R1S[0x10] == rv_17.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar83[1] = -(R1S[0x11] == rv_17.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar83[2] = -(R1S[0x12] == rv_17.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar83[3] = -(R1S[0x13] == rv_17.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar83[4] = 0xff;
  auVar83[5] = 0xff;
  auVar83[6] = 0xff;
  auVar83[7] = 0xff;
  auVar83[8] = 0xff;
  auVar83[9] = 0xff;
  auVar83[10] = 0xff;
  auVar83[0xb] = 0xff;
  auVar83[0xc] = 0xff;
  auVar83[0xd] = 0xff;
  auVar83[0xe] = 0xff;
  auVar83[0xf] = 0xff;
  auVar44 = auVar44 & auVar83;
  rv_21.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) | (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) == 0xffff;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv_17.super_base_blob<160U>;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv_17.super_base_blob<160U> >> 8)
  ;
  rv_18.super_base_blob<160U>.m_data._M_elems[2] =
       (uchar)((ulong)&rv_17.super_base_blob<160U> >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] =
       (uchar)((ulong)&rv_17.super_base_blob<160U> >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] =
       (uchar)((ulong)&rv_17.super_base_blob<160U> >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] =
       (uchar)((ulong)&rv_17.super_base_blob<160U> >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] =
       (uchar)((ulong)&rv_17.super_base_blob<160U> >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] =
       (uchar)((ulong)&rv_17.super_base_blob<160U> >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (string *)R1S;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_128;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_e0 = &rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_21,&local_178,1,2,REQUIRE,0xf719ad,(size_t)&rv_12,0x74,
             &local_f8,"R1S",&local_118);
  puVar1 = rv_21.super_base_blob<160U>.m_data._M_elems + 0x10;
  boost::detail::shared_count::~shared_count((shared_count *)puVar1);
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  puVar3 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (puVar8 != puVar3) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = &DAT_00000075;
  file_40.m_begin = (iterator)&local_688;
  msg_40.m_end = pvVar25;
  msg_40.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_698,
             msg_40);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_17,R1S);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"   0x",5);
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)puVar1;
  uVar11 = rv_21.super_base_blob<160U>.m_data._M_elems[0];
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)puVar1 >> 8);
  uVar12 = rv_21.super_base_blob<160U>.m_data._M_elems[1];
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)puVar1 >> 0x10);
  uVar13 = rv_21.super_base_blob<160U>.m_data._M_elems[2];
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)puVar1 >> 0x18);
  uVar14 = rv_21.super_base_blob<160U>.m_data._M_elems[3];
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)puVar1 >> 0x20);
  uVar15 = rv_21.super_base_blob<160U>.m_data._M_elems[4];
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)puVar1 >> 0x28);
  uVar16 = rv_21.super_base_blob<160U>.m_data._M_elems[5];
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)puVar1 >> 0x30);
  uVar17 = rv_21.super_base_blob<160U>.m_data._M_elems[6];
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)puVar1 >> 0x38);
  uVar18 = rv_21.super_base_blob<160U>.m_data._M_elems[7];
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,
                       "   ");
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar3;
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar3 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar3 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar3 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar3 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar3 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar3 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar3 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_16._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_16._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_16._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_16._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_16._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_16._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_16._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_16._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_16._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_18,str_16);
  auVar45[0] = -(R1S[0] == rv_18.super_base_blob<160U>.m_data._M_elems[0]);
  auVar45[1] = -(R1S[1] == rv_18.super_base_blob<160U>.m_data._M_elems[1]);
  auVar45[2] = -(R1S[2] == rv_18.super_base_blob<160U>.m_data._M_elems[2]);
  auVar45[3] = -(R1S[3] == rv_18.super_base_blob<160U>.m_data._M_elems[3]);
  auVar45[4] = -(R1S[4] == rv_18.super_base_blob<160U>.m_data._M_elems[4]);
  auVar45[5] = -(R1S[5] == rv_18.super_base_blob<160U>.m_data._M_elems[5]);
  auVar45[6] = -(R1S[6] == rv_18.super_base_blob<160U>.m_data._M_elems[6]);
  auVar45[7] = -(R1S[7] == rv_18.super_base_blob<160U>.m_data._M_elems[7]);
  auVar45[8] = -(R1S[8] == rv_18.super_base_blob<160U>.m_data._M_elems[8]);
  auVar45[9] = -(R1S[9] == rv_18.super_base_blob<160U>.m_data._M_elems[9]);
  auVar45[10] = -(R1S[10] == rv_18.super_base_blob<160U>.m_data._M_elems[10]);
  auVar45[0xb] = -(R1S[0xb] == rv_18.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar45[0xc] = -(R1S[0xc] == rv_18.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar45[0xd] = -(R1S[0xd] == rv_18.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar45[0xe] = -(R1S[0xe] == rv_18.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar45[0xf] = -(R1S[0xf] == rv_18.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar84[0] = -(R1S[0x10] == rv_18.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar84[1] = -(R1S[0x11] == rv_18.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar84[2] = -(R1S[0x12] == rv_18.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar84[3] = -(R1S[0x13] == rv_18.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar84[4] = 0xff;
  auVar84[5] = 0xff;
  auVar84[6] = 0xff;
  auVar84[7] = 0xff;
  auVar84[8] = 0xff;
  auVar84[9] = 0xff;
  auVar84[10] = 0xff;
  auVar84[0xb] = 0xff;
  auVar84[0xc] = 0xff;
  auVar84[0xd] = 0xff;
  auVar84[0xe] = 0xff;
  auVar84[0xf] = 0xff;
  auVar45 = auVar45 & auVar84;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_128 = (string *)0xf715e0;
  local_120 = "";
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_130;
  local_138 = R1S;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_138;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_130 = (base_blob<256U> *)&rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf719c6,(size_t)&local_128,0x75,
             &local_f8,"R1S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  puVar3 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (puVar8 != puVar3) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar2) {
    operator_delete(psVar9,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x76;
  file_41.m_begin = (iterator)&local_6a8;
  msg_41.m_end = pvVar25;
  msg_41.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_6b8,
             msg_41);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_17,R1S);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0,"   0x",5);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = uVar11;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = uVar12;
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = uVar13;
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = uVar14;
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = uVar15;
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = uVar16;
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = uVar17;
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = uVar18;
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,
                       "-trash;%^&   ");
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar3;
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar3 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar3 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar3 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar3 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar3 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar3 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar3 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_17._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_17._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_17._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_17._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_17._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_17._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_17._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_17._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_17._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_18,str_17);
  auVar46[0] = -(R1S[0] == rv_18.super_base_blob<160U>.m_data._M_elems[0]);
  auVar46[1] = -(R1S[1] == rv_18.super_base_blob<160U>.m_data._M_elems[1]);
  auVar46[2] = -(R1S[2] == rv_18.super_base_blob<160U>.m_data._M_elems[2]);
  auVar46[3] = -(R1S[3] == rv_18.super_base_blob<160U>.m_data._M_elems[3]);
  auVar46[4] = -(R1S[4] == rv_18.super_base_blob<160U>.m_data._M_elems[4]);
  auVar46[5] = -(R1S[5] == rv_18.super_base_blob<160U>.m_data._M_elems[5]);
  auVar46[6] = -(R1S[6] == rv_18.super_base_blob<160U>.m_data._M_elems[6]);
  auVar46[7] = -(R1S[7] == rv_18.super_base_blob<160U>.m_data._M_elems[7]);
  auVar46[8] = -(R1S[8] == rv_18.super_base_blob<160U>.m_data._M_elems[8]);
  auVar46[9] = -(R1S[9] == rv_18.super_base_blob<160U>.m_data._M_elems[9]);
  auVar46[10] = -(R1S[10] == rv_18.super_base_blob<160U>.m_data._M_elems[10]);
  auVar46[0xb] = -(R1S[0xb] == rv_18.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar46[0xc] = -(R1S[0xc] == rv_18.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar46[0xd] = -(R1S[0xd] == rv_18.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar46[0xe] = -(R1S[0xe] == rv_18.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar46[0xf] = -(R1S[0xf] == rv_18.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar85[0] = -(R1S[0x10] == rv_18.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar85[1] = -(R1S[0x11] == rv_18.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar85[2] = -(R1S[0x12] == rv_18.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar85[3] = -(R1S[0x13] == rv_18.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar85[4] = 0xff;
  auVar85[5] = 0xff;
  auVar85[6] = 0xff;
  auVar85[7] = 0xff;
  auVar85[8] = 0xff;
  auVar85[9] = 0xff;
  auVar85[10] = 0xff;
  auVar85[0xb] = 0xff;
  auVar85[0xc] = 0xff;
  auVar85[0xd] = 0xff;
  auVar85[0xe] = 0xff;
  auVar85[0xf] = 0xff;
  auVar46 = auVar46 & auVar85;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_128 = (string *)0xf715e0;
  local_120 = "";
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_130;
  local_138 = R1S;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_138;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_130 = (base_blob<256U> *)&rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf719ed,(size_t)&local_128,0x76,
             &local_f8,"R1S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  puVar3 = rv.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (puVar8 != puVar3) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar2) {
    operator_delete(psVar9,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x77;
  file_42.m_begin = (iterator)&local_6c8;
  msg_42.m_end = pvVar25;
  msg_42.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_6d8,
             msg_42);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  base_blob<160u>::ToString_abi_cxx11_((string *)&rv_17,R1S);
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_17,0
                       ,0," \t \n  \n \f\n\r\t\v\t  0x",0x12);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = uVar11;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = uVar12;
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = uVar13;
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = uVar14;
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = uVar15;
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = uVar16;
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = uVar17;
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = uVar18;
  }
  else {
    rv_21.super_base_blob<160U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv_21.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv_21.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv_21.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv_21.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv_21.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv_21.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv_21.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    rv_21.super_base_blob<160U>.m_data._M_elems._16_4_ = SUB84(paVar23->_M_allocated_capacity,0);
    uStack_84 = (undefined4)(paVar23->_M_allocated_capacity >> 0x20);
  }
  sVar6 = pbVar20->_M_string_length;
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = (uchar)sVar6;
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv_21,
                       "   \t \n  \n \f\n\r\t\v\t");
  rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)puVar3;
  rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)puVar3 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)puVar3 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)puVar3 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)puVar3 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)puVar3 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)puVar3 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)puVar3 >> 0x38);
  pcVar5 = (pbVar20->_M_dataplus)._M_p;
  paVar23 = &pbVar20->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar23) {
    sVar6 = paVar23->_M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
    rv.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar7;
    rv.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar7 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar7 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar7 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar7 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar7 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar7 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar7 >> 0x38);
  }
  else {
    rv.super_base_blob<256U>.m_data._M_elems[0] = (uchar)pcVar5;
    rv.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)pcVar5 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)pcVar5 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)pcVar5 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)pcVar5 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)pcVar5 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)pcVar5 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)pcVar5 >> 0x38);
    sVar6 = paVar23->_M_allocated_capacity;
    rv.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)sVar6;
    rv.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)(sVar6 >> 8);
    rv.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)(sVar6 >> 0x10);
    rv.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)(sVar6 >> 0x18);
    rv.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)(sVar6 >> 0x20);
    rv.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)(sVar6 >> 0x28);
    rv.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)(sVar6 >> 0x30);
    rv.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)(sVar6 >> 0x38);
  }
  sVar6 = pbVar20->_M_string_length;
  rv.super_base_blob<256U>.m_data._M_elems[8] = (uchar)sVar6;
  rv.super_base_blob<256U>.m_data._M_elems[9] = (uchar)(sVar6 >> 8);
  rv.super_base_blob<256U>.m_data._M_elems[10] = (uchar)(sVar6 >> 0x10);
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)(sVar6 >> 0x18);
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)(sVar6 >> 0x20);
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)(sVar6 >> 0x28);
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)(sVar6 >> 0x30);
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)(sVar6 >> 0x38);
  (pbVar20->_M_dataplus)._M_p = (pointer)paVar23;
  pbVar20->_M_string_length = 0;
  (pbVar20->field_2)._M_local_buf[0] = '\0';
  str_18._M_str._1_1_ = rv.super_base_blob<256U>.m_data._M_elems[1];
  str_18._M_str._0_1_ = rv.super_base_blob<256U>.m_data._M_elems[0];
  str_18._M_str._2_1_ = rv.super_base_blob<256U>.m_data._M_elems[2];
  str_18._M_str._3_1_ = rv.super_base_blob<256U>.m_data._M_elems[3];
  str_18._M_str._4_1_ = rv.super_base_blob<256U>.m_data._M_elems[4];
  str_18._M_str._5_1_ = rv.super_base_blob<256U>.m_data._M_elems[5];
  str_18._M_str._6_1_ = rv.super_base_blob<256U>.m_data._M_elems[6];
  str_18._M_str._7_1_ = rv.super_base_blob<256U>.m_data._M_elems[7];
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_18._M_len = sVar6;
  base_blob<160U>::SetHexDeprecated((base_blob<160U> *)&rv_18,str_18);
  auVar47[0] = -(R1S[0] == rv_18.super_base_blob<160U>.m_data._M_elems[0]);
  auVar47[1] = -(R1S[1] == rv_18.super_base_blob<160U>.m_data._M_elems[1]);
  auVar47[2] = -(R1S[2] == rv_18.super_base_blob<160U>.m_data._M_elems[2]);
  auVar47[3] = -(R1S[3] == rv_18.super_base_blob<160U>.m_data._M_elems[3]);
  auVar47[4] = -(R1S[4] == rv_18.super_base_blob<160U>.m_data._M_elems[4]);
  auVar47[5] = -(R1S[5] == rv_18.super_base_blob<160U>.m_data._M_elems[5]);
  auVar47[6] = -(R1S[6] == rv_18.super_base_blob<160U>.m_data._M_elems[6]);
  auVar47[7] = -(R1S[7] == rv_18.super_base_blob<160U>.m_data._M_elems[7]);
  auVar47[8] = -(R1S[8] == rv_18.super_base_blob<160U>.m_data._M_elems[8]);
  auVar47[9] = -(R1S[9] == rv_18.super_base_blob<160U>.m_data._M_elems[9]);
  auVar47[10] = -(R1S[10] == rv_18.super_base_blob<160U>.m_data._M_elems[10]);
  auVar47[0xb] = -(R1S[0xb] == rv_18.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar47[0xc] = -(R1S[0xc] == rv_18.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar47[0xd] = -(R1S[0xd] == rv_18.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar47[0xe] = -(R1S[0xe] == rv_18.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar47[0xf] = -(R1S[0xf] == rv_18.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar86[0] = -(R1S[0x10] == rv_18.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar86[1] = -(R1S[0x11] == rv_18.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar86[2] = -(R1S[0x12] == rv_18.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar86[3] = -(R1S[0x13] == rv_18.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar86[4] = 0xff;
  auVar86[5] = 0xff;
  auVar86[6] = 0xff;
  auVar86[7] = 0xff;
  auVar86[8] = 0xff;
  auVar86[9] = 0xff;
  auVar86[10] = 0xff;
  auVar86[0xb] = 0xff;
  auVar86[0xc] = 0xff;
  auVar86[0xd] = 0xff;
  auVar86[0xe] = 0xff;
  auVar86[0xf] = 0xff;
  auVar47 = auVar47 & auVar86;
  rv_12.super_base_blob<160U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf) == 0xffff;
  rv_12.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_128 = (string *)0xf715e0;
  local_120 = "";
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = (uint160 *)&local_130;
  local_138 = R1S;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (uint160 *)&local_138;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_130 = (base_blob<256U> *)&rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv_12,&local_178,1,2,REQUIRE,0xf71a42,(size_t)&local_128,0x77,
             &local_f8,"R1S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv_12.super_base_blob<160U>.m_data._M_elems + 0x10));
  puVar8 = (undefined1 *)
           CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(rv.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(rv.super_base_blob<256U>.m_data._M_elems[3],
                                                        CONCAT12(rv.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(rv.super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          rv.super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  if (puVar8 != puVar3) {
    operator_delete(puVar8,CONCAT17(rv.super_base_blob<256U>.m_data._M_elems[0x17],
                                    CONCAT16(rv.super_base_blob<256U>.m_data._M_elems[0x16],
                                             CONCAT15(rv.super_base_blob<256U>.m_data._M_elems[0x15]
                                                      ,CONCAT14(rv.super_base_blob<256U>.m_data.
                                                                _M_elems[0x14],
                                                                CONCAT13(rv.super_base_blob<256U>.
                                                                         m_data._M_elems[0x13],
                                                                         CONCAT12(rv.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(rv.super_base_blob<256U>.m_data._M_elems
                                                           [0x11],rv.super_base_blob<256U>.m_data.
                                                                  _M_elems[0x10]))))))) + 1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_21.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_21.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_21.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_21.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_21.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_21.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_21.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_21.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar1) {
    operator_delete(psVar9,CONCAT44(uStack_84,rv_21.super_base_blob<160U>.m_data._M_elems._16_4_) +
                           1);
  }
  psVar9 = (shared_count *)
           CONCAT17(rv_17.super_base_blob<160U>.m_data._M_elems[7],
                    CONCAT16(rv_17.super_base_blob<160U>.m_data._M_elems[6],
                             CONCAT15(rv_17.super_base_blob<160U>.m_data._M_elems[5],
                                      CONCAT14(rv_17.super_base_blob<160U>.m_data._M_elems[4],
                                               CONCAT13(rv_17.super_base_blob<160U>.m_data._M_elems
                                                        [3],CONCAT12(rv_17.super_base_blob<160U>.
                                                                     m_data._M_elems[2],
                                                                     CONCAT11(rv_17.
                                                  super_base_blob<160U>.m_data._M_elems[1],
                                                  rv_17.super_base_blob<160U>.m_data._M_elems[0]))))
                                     )));
  if (psVar9 != (shared_count *)puVar2) {
    operator_delete(psVar9,(ulong)(uint)rv_17.super_base_blob<160U>.m_data._M_elems._16_4_ + 1);
  }
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x78;
  file_43.m_begin = (iterator)&local_6e8;
  msg_43.m_end = pvVar25;
  msg_43.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_6f8,
             msg_43);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  base_blob<160U>::SetHexDeprecated
            (&rv_21.super_base_blob<160U>,(string_view)(ZEXT816(0xf73bdc) << 0x40));
  auVar48[0] = -(ZeroS[0] == rv_21.super_base_blob<160U>.m_data._M_elems[0]);
  auVar48[1] = -(ZeroS[1] == rv_21.super_base_blob<160U>.m_data._M_elems[1]);
  auVar48[2] = -(ZeroS[2] == rv_21.super_base_blob<160U>.m_data._M_elems[2]);
  auVar48[3] = -(ZeroS[3] == rv_21.super_base_blob<160U>.m_data._M_elems[3]);
  auVar48[4] = -(ZeroS[4] == rv_21.super_base_blob<160U>.m_data._M_elems[4]);
  auVar48[5] = -(ZeroS[5] == rv_21.super_base_blob<160U>.m_data._M_elems[5]);
  auVar48[6] = -(ZeroS[6] == rv_21.super_base_blob<160U>.m_data._M_elems[6]);
  auVar48[7] = -(ZeroS[7] == rv_21.super_base_blob<160U>.m_data._M_elems[7]);
  auVar48[8] = -(ZeroS[8] == rv_21.super_base_blob<160U>.m_data._M_elems[8]);
  auVar48[9] = -(ZeroS[9] == rv_21.super_base_blob<160U>.m_data._M_elems[9]);
  auVar48[10] = -(ZeroS[10] == rv_21.super_base_blob<160U>.m_data._M_elems[10]);
  auVar48[0xb] = -(ZeroS[0xb] == rv_21.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar48[0xc] = -(ZeroS[0xc] == rv_21.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar48[0xd] = -(ZeroS[0xd] == rv_21.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar48[0xe] = -(ZeroS[0xe] == rv_21.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar48[0xf] = -(ZeroS[0xf] == rv_21.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar87[0] = -(ZeroS[0x10] == rv_21.super_base_blob<160U>.m_data._M_elems[0x10]);
  auVar87[1] = -(ZeroS[0x11] == rv_21.super_base_blob<160U>.m_data._M_elems[0x11]);
  auVar87[2] = -(ZeroS[0x12] == rv_21.super_base_blob<160U>.m_data._M_elems[0x12]);
  auVar87[3] = -(ZeroS[0x13] == rv_21.super_base_blob<160U>.m_data._M_elems[0x13]);
  auVar87[4] = 0xff;
  auVar87[5] = 0xff;
  auVar87[6] = 0xff;
  auVar87[7] = 0xff;
  auVar87[8] = 0xff;
  auVar87[9] = 0xff;
  auVar87[10] = 0xff;
  auVar87[0xb] = 0xff;
  auVar87[0xc] = 0xff;
  auVar87[0xd] = 0xff;
  auVar87[0xe] = 0xff;
  auVar87[0xf] = 0xff;
  auVar48 = auVar48 & auVar87;
  rv.super_base_blob<256U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) == 0xffff;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv_21.super_base_blob<160U>;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv_21.super_base_blob<160U> >> 8)
  ;
  rv_12.super_base_blob<160U>.m_data._M_elems[2] =
       (uchar)((ulong)&rv_21.super_base_blob<160U> >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] =
       (uchar)((ulong)&rv_21.super_base_blob<160U> >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] =
       (uchar)((ulong)&rv_21.super_base_blob<160U> >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] =
       (uchar)((ulong)&rv_21.super_base_blob<160U> >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] =
       (uchar)((ulong)&rv_21.super_base_blob<160U> >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] =
       (uchar)((ulong)&rv_21.super_base_blob<160U> >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe9;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_100 = &rv_18;
  local_e0 = &rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,2,REQUIRE,0xf71a95,(size_t)&rv_17,0x78,&local_f8,
             "ZeroS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x79;
  file_44.m_begin = (iterator)&local_708;
  msg_44.m_end = pvVar25;
  msg_44.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_718,
             msg_44);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  str_19._M_str = R1ArrayHex;
  str_19._M_len = 0x40;
  base_blob<160U>::SetHexDeprecated(&rv_21.super_base_blob<160U>,str_19);
  auVar49[0] = -(R1S[0] == rv_21.super_base_blob<160U>.m_data._M_elems[0]);
  auVar49[1] = -(R1S[1] == rv_21.super_base_blob<160U>.m_data._M_elems[1]);
  auVar49[2] = -(R1S[2] == rv_21.super_base_blob<160U>.m_data._M_elems[2]);
  auVar49[3] = -(R1S[3] == rv_21.super_base_blob<160U>.m_data._M_elems[3]);
  auVar49[4] = -(R1S[4] == rv_21.super_base_blob<160U>.m_data._M_elems[4]);
  auVar49[5] = -(R1S[5] == rv_21.super_base_blob<160U>.m_data._M_elems[5]);
  auVar49[6] = -(R1S[6] == rv_21.super_base_blob<160U>.m_data._M_elems[6]);
  auVar49[7] = -(R1S[7] == rv_21.super_base_blob<160U>.m_data._M_elems[7]);
  auVar49[8] = -(R1S[8] == rv_21.super_base_blob<160U>.m_data._M_elems[8]);
  auVar49[9] = -(R1S[9] == rv_21.super_base_blob<160U>.m_data._M_elems[9]);
  auVar49[10] = -(R1S[10] == rv_21.super_base_blob<160U>.m_data._M_elems[10]);
  auVar49[0xb] = -(R1S[0xb] == rv_21.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar49[0xc] = -(R1S[0xc] == rv_21.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar49[0xd] = -(R1S[0xd] == rv_21.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar49[0xe] = -(R1S[0xe] == rv_21.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar49[0xf] = -(R1S[0xf] == rv_21.super_base_blob<160U>.m_data._M_elems[0xf]);
  auVar88[0] = -(rv_21.super_base_blob<160U>.m_data._M_elems[0x10] == (uchar)R1S._16_4_);
  auVar88[1] = -(rv_21.super_base_blob<160U>.m_data._M_elems[0x11] == SUB41(R1S._16_4_,1));
  auVar88[2] = -(rv_21.super_base_blob<160U>.m_data._M_elems[0x12] == SUB41(R1S._16_4_,2));
  auVar88[3] = -(rv_21.super_base_blob<160U>.m_data._M_elems[0x13] == SUB41(R1S._16_4_,3));
  auVar88[4] = 0xff;
  auVar88[5] = 0xff;
  auVar88[6] = 0xff;
  auVar88[7] = 0xff;
  auVar88[8] = 0xff;
  auVar88[9] = 0xff;
  auVar88[10] = 0xff;
  auVar88[0xb] = 0xff;
  auVar88[0xc] = 0xff;
  auVar88[0xd] = 0xff;
  auVar88[0xe] = 0xff;
  auVar88[0xf] = 0xff;
  auVar49 = auVar49 & auVar88;
  rv.super_base_blob<256U>.m_data._M_elems[0] =
       (ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) == 0xffff;
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = 0x81;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv_21;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv_21 >> 8);
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv_21 >> 0x10);
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv_21 >> 0x18);
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv_21 >> 0x20);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv_21 >> 0x28);
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv_21 >> 0x30);
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv_21 >> 0x38);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  local_100 = &rv_18;
  local_e0 = &rv_12;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,2,REQUIRE,0xf71726,(size_t)&rv_17,0x79,&local_f8,
             "uint160S(R1ArrayHex)",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x7b;
  file_45.m_begin = (iterator)&local_728;
  msg_45.m_end = pvVar25;
  msg_45.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_738,
             msg_45);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = R1S[0x10];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = R1S[0x11];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = R1S[0x12];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = R1S[0x13];
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = R1S[0];
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = R1S[1];
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = R1S[2];
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = R1S[3];
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = R1S[4];
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = R1S[5];
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = R1S[6];
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = R1S[7];
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = R1S[8];
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = R1S[9];
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = R1S[10];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = R1S[0xb];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = R1S[0xc];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = R1S[0xd];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = R1S[0xe];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = R1S[0xf];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv_21;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv_21 >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv_21 >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv_21 >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv_21 >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv_21 >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv_21 >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv_21 >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0x81;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,2,REQUIRE,0xf71ab7,(size_t)&rv_17,0x7b,&local_f8,
             "R1S",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x7c;
  file_46.m_begin = (iterator)&local_748;
  msg_46.m_end = pvVar25;
  msg_46.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_758,
             msg_46);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = ZeroS[0x10];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = ZeroS[0x11];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = ZeroS[0x12];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = ZeroS[0x13];
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = ZeroS[0];
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = ZeroS[1];
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = ZeroS[2];
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = ZeroS[3];
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = ZeroS[4];
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = ZeroS[5];
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = ZeroS[6];
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = ZeroS[7];
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = ZeroS[8];
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = ZeroS[9];
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = ZeroS[10];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = ZeroS[0xb];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = ZeroS[0xc];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = ZeroS[0xd];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = ZeroS[0xe];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = ZeroS[0xf];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv_21;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv_21 >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv_21 >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv_21 >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv_21 >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv_21 >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv_21 >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv_21 >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  rv_18.super_base_blob<160U>.m_data._M_elems[0] = 0xe9;
  rv_18.super_base_blob<160U>.m_data._M_elems[1] = 't';
  rv_18.super_base_blob<160U>.m_data._M_elems[2] = '<';
  rv_18.super_base_blob<160U>.m_data._M_elems[3] = '\x01';
  rv_18.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  pvVar24 = (iterator)0x1;
  pvVar25 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,2,REQUIRE,0xf71ac4,(size_t)&rv_17,0x7c,&local_f8,
             "ZeroS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x7d;
  file_47.m_begin = (iterator)&local_768;
  msg_47.m_end = pvVar25;
  msg_47.m_begin = pvVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_778,
             msg_47);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  rv_21.super_base_blob<160U>.m_data._M_elems[0x10] = OneS[0x10];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x11] = OneS[0x11];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x12] = OneS[0x12];
  rv_21.super_base_blob<160U>.m_data._M_elems[0x13] = OneS[0x13];
  rv_21.super_base_blob<160U>.m_data._M_elems[0] = OneS[0];
  rv_21.super_base_blob<160U>.m_data._M_elems[1] = OneS[1];
  rv_21.super_base_blob<160U>.m_data._M_elems[2] = OneS[2];
  rv_21.super_base_blob<160U>.m_data._M_elems[3] = OneS[3];
  rv_21.super_base_blob<160U>.m_data._M_elems[4] = OneS[4];
  rv_21.super_base_blob<160U>.m_data._M_elems[5] = OneS[5];
  rv_21.super_base_blob<160U>.m_data._M_elems[6] = OneS[6];
  rv_21.super_base_blob<160U>.m_data._M_elems[7] = OneS[7];
  rv_21.super_base_blob<160U>.m_data._M_elems[8] = OneS[8];
  rv_21.super_base_blob<160U>.m_data._M_elems[9] = OneS[9];
  rv_21.super_base_blob<160U>.m_data._M_elems[10] = OneS[10];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xb] = OneS[0xb];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xc] = OneS[0xc];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xd] = OneS[0xd];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xe] = OneS[0xe];
  rv_21.super_base_blob<160U>.m_data._M_elems[0xf] = OneS[0xf];
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0] = 0xe0;
  rv_17.super_base_blob<160U>.m_data._M_elems[1] = '\x15';
  rv_17.super_base_blob<160U>.m_data._M_elems[2] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[8] = '?';
  rv_17.super_base_blob<160U>.m_data._M_elems[9] = '\x16';
  rv_17.super_base_blob<160U>.m_data._M_elems[10] = 0xf7;
  rv_17.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  rv_17.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  rv_12.super_base_blob<160U>.m_data._M_elems[0] = (uchar)&rv_21;
  rv_12.super_base_blob<160U>.m_data._M_elems[1] = (uchar)((ulong)&rv_21 >> 8);
  rv_12.super_base_blob<160U>.m_data._M_elems[2] = (uchar)((ulong)&rv_21 >> 0x10);
  rv_12.super_base_blob<160U>.m_data._M_elems[3] = (uchar)((ulong)&rv_21 >> 0x18);
  rv_12.super_base_blob<160U>.m_data._M_elems[4] = (uchar)((ulong)&rv_21 >> 0x20);
  rv_12.super_base_blob<160U>.m_data._M_elems[5] = (uchar)((ulong)&rv_21 >> 0x28);
  rv_12.super_base_blob<160U>.m_data._M_elems[6] = (uchar)((ulong)&rv_21 >> 0x30);
  rv_12.super_base_blob<160U>.m_data._M_elems[7] = (uchar)((ulong)&rv_21 >> 0x38);
  local_f0 = (undefined1  [8])(local_f0._1_8_ << 8);
  local_f8 = &PTR__lazy_ostream_013b34c0;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &rv_12;
  builtin_memcpy(rv_18.super_base_blob<160U>.m_data._M_elems,"\x1du<\x01",5);
  rv_18.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  rv_18.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013b34c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &rv_18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_178,1,2,REQUIRE,0xf71ad3,(size_t)&rv_17,0x7d,&local_f8,
             "OneS",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( basics ) // constructors, equality, inequality
{
    // constructor uint256(vector<char>):
    BOOST_CHECK_EQUAL(R1L.ToString(), ArrayToString(R1Array,32));
    BOOST_CHECK_EQUAL(R1S.ToString(), ArrayToString(R1Array,20));
    BOOST_CHECK_EQUAL(R2L.ToString(), ArrayToString(R2Array,32));
    BOOST_CHECK_EQUAL(R2S.ToString(), ArrayToString(R2Array,20));
    BOOST_CHECK_EQUAL(ZeroL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_EQUAL(ZeroS.ToString(), ArrayToString(ZeroArray,20));
    BOOST_CHECK_EQUAL(OneL.ToString(), ArrayToString(OneArray,32));
    BOOST_CHECK_EQUAL(OneS.ToString(), ArrayToString(OneArray,20));
    BOOST_CHECK_EQUAL(MaxL.ToString(), ArrayToString(MaxArray,32));
    BOOST_CHECK_EQUAL(MaxS.ToString(), ArrayToString(MaxArray,20));
    BOOST_CHECK_NE(OneL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_NE(OneS.ToString(), ArrayToString(ZeroArray,20));

    // == and !=
    BOOST_CHECK_NE(R1L, R2L); BOOST_CHECK_NE(R1S, R2S);
    BOOST_CHECK_NE(ZeroL, OneL); BOOST_CHECK_NE(ZeroS, OneS);
    BOOST_CHECK_NE(OneL, ZeroL); BOOST_CHECK_NE(OneS, ZeroS);
    BOOST_CHECK_NE(MaxL, ZeroL); BOOST_CHECK_NE(MaxS, ZeroS);

    // String Constructor and Copy Constructor
    BOOST_CHECK_EQUAL(uint256S("0x"+R1L.ToString()), R1L);
    BOOST_CHECK_EQUAL(uint256S("0x"+R2L.ToString()), R2L);
    BOOST_CHECK_EQUAL(uint256S("0x"+ZeroL.ToString()), ZeroL);
    BOOST_CHECK_EQUAL(uint256S("0x"+OneL.ToString()), OneL);
    BOOST_CHECK_EQUAL(uint256S("0x"+MaxL.ToString()), MaxL);
    BOOST_CHECK_EQUAL(uint256S(R1L.ToString()), R1L);
    BOOST_CHECK_EQUAL(uint256S("   0x"+R1L.ToString()+"   "), R1L);
    BOOST_CHECK_EQUAL(uint256S("   0x"+R1L.ToString()+"-trash;%^&   "), R1L);
    BOOST_CHECK_EQUAL(uint256S("\t \n  \n \f\n\r\t\v\t   0x"+R1L.ToString()+"  \t \n  \n \f\n\r\t\v\t "), R1L);
    BOOST_CHECK_EQUAL(uint256S(""), ZeroL);
    BOOST_CHECK_EQUAL(uint256S("1"), OneL);
    BOOST_CHECK_EQUAL(R1L, uint256S(R1ArrayHex));
    BOOST_CHECK_EQUAL(uint256(R1L), R1L);
    BOOST_CHECK_EQUAL(uint256(ZeroL), ZeroL);
    BOOST_CHECK_EQUAL(uint256(OneL), OneL);

    BOOST_CHECK_EQUAL(uint160S("0x"+R1S.ToString()), R1S);
    BOOST_CHECK_EQUAL(uint160S("0x"+R2S.ToString()), R2S);
    BOOST_CHECK_EQUAL(uint160S("0x"+ZeroS.ToString()), ZeroS);
    BOOST_CHECK_EQUAL(uint160S("0x"+OneS.ToString()), OneS);
    BOOST_CHECK_EQUAL(uint160S("0x"+MaxS.ToString()), MaxS);
    BOOST_CHECK_EQUAL(uint160S(R1S.ToString()), R1S);
    BOOST_CHECK_EQUAL(uint160S("   0x"+R1S.ToString()+"   "), R1S);
    BOOST_CHECK_EQUAL(uint160S("   0x"+R1S.ToString()+"-trash;%^&   "), R1S);
    BOOST_CHECK_EQUAL(uint160S(" \t \n  \n \f\n\r\t\v\t  0x"+R1S.ToString()+"   \t \n  \n \f\n\r\t\v\t"), R1S);
    BOOST_CHECK_EQUAL(uint160S(""), ZeroS);
    BOOST_CHECK_EQUAL(R1S, uint160S(R1ArrayHex));

    BOOST_CHECK_EQUAL(uint160(R1S), R1S);
    BOOST_CHECK_EQUAL(uint160(ZeroS), ZeroS);
    BOOST_CHECK_EQUAL(uint160(OneS), OneS);
}